

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Primitive PVar13;
  undefined4 uVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  long lVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined8 uVar26;
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  byte bVar49;
  int iVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar54;
  RTCFilterFunctionN p_Var55;
  RTCRayN *pRVar56;
  bool bVar57;
  long lVar58;
  ulong uVar59;
  bool bVar60;
  uint uVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  uint uVar65;
  short sVar66;
  undefined2 uVar103;
  float fVar67;
  float fVar104;
  float fVar105;
  vfloat_impl<4> p00;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar132;
  float fVar133;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar134;
  float fVar145;
  float fVar146;
  vfloat4 v;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar147;
  float fVar155;
  float fVar157;
  vfloat4 v_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar161;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar177;
  float fVar203;
  float fVar204;
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  float fVar205;
  float fVar206;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar207;
  float fVar208;
  float fVar211;
  float fVar213;
  undefined1 auVar209 [16];
  float fVar212;
  float fVar214;
  float fVar215;
  undefined1 auVar210 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar232;
  float fVar236;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar224 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar243;
  float fVar252;
  float fVar253;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar254;
  float fVar267;
  float fVar268;
  undefined1 auVar255 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar269;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar270;
  float fVar280;
  float fVar281;
  vfloat4 a;
  undefined1 auVar271 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar282;
  float fVar283;
  float fVar294;
  float fVar296;
  vfloat4 a_2;
  float fVar298;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  float fVar295;
  float fVar297;
  float fVar299;
  float fVar300;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar301;
  float fVar302;
  float fVar311;
  float fVar313;
  float fVar315;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar307 [16];
  float fVar312;
  float fVar314;
  float fVar316;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar327;
  float fVar328;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  vfloat_impl<4> p03;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [24];
  undefined1 (*local_390) [16];
  Primitive *local_388;
  ulong local_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  undefined8 local_338;
  float fStack_330;
  float fStack_32c;
  float afStack_328 [4];
  RTCFilterFunctionNArguments local_318;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  uint local_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float afStack_58 [10];
  ulong uVar53;
  undefined1 auVar99 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 uVar102;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  
  PVar13 = prim[1];
  uVar51 = (ulong)(byte)PVar13;
  lVar54 = uVar51 * 0x25;
  pPVar4 = prim + lVar54 + 6;
  fVar146 = *(float *)(pPVar4 + 0xc);
  fVar147 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar146;
  fVar155 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar146;
  fVar157 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar146;
  fVar134 = *(float *)(ray + k * 4 + 0x40) * fVar146;
  fVar145 = *(float *)(ray + k * 4 + 0x50) * fVar146;
  fVar146 = *(float *)(ray + k * 4 + 0x60) * fVar146;
  uVar14 = *(undefined4 *)(prim + uVar51 * 4 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar259._8_4_ = 0;
  auVar259._0_8_ = uVar53;
  auVar259._12_2_ = uVar103;
  auVar259._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar136._12_4_ = auVar259._12_4_;
  auVar136._8_2_ = 0;
  auVar136._0_8_ = uVar53;
  auVar136._10_2_ = uVar103;
  auVar68._10_6_ = auVar136._10_6_;
  auVar68._8_2_ = uVar103;
  auVar68._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar28._4_8_ = auVar68._8_8_;
  auVar28._2_2_ = uVar103;
  auVar28._0_2_ = uVar103;
  fVar317 = (float)((int)sVar66 >> 8);
  fVar322 = (float)(auVar28._0_4_ >> 0x18);
  fVar324 = (float)(auVar68._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 5 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar53;
  auVar109._12_2_ = uVar103;
  auVar109._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar53;
  auVar108._10_2_ = uVar103;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar103;
  auVar107._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar29._4_8_ = auVar107._8_8_;
  auVar29._2_2_ = uVar103;
  auVar29._0_2_ = uVar103;
  fVar160 = (float)((int)sVar66 >> 8);
  fVar172 = (float)(auVar29._0_4_ >> 0x18);
  fVar174 = (float)(auVar107._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 6 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar53;
  auVar112._12_2_ = uVar103;
  auVar112._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar53;
  auVar111._10_2_ = uVar103;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar103;
  auVar110._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar30._4_8_ = auVar110._8_8_;
  auVar30._2_2_ = uVar103;
  auVar30._0_2_ = uVar103;
  fVar207 = (float)((int)sVar66 >> 8);
  fVar211 = (float)(auVar30._0_4_ >> 0x18);
  fVar213 = (float)(auVar110._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0xf + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar53;
  auVar115._12_2_ = uVar103;
  auVar115._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar53;
  auVar114._10_2_ = uVar103;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar103;
  auVar113._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar31._4_8_ = auVar113._8_8_;
  auVar31._2_2_ = uVar103;
  auVar31._0_2_ = uVar103;
  fVar67 = (float)((int)sVar66 >> 8);
  fVar104 = (float)(auVar31._0_4_ >> 0x18);
  fVar105 = (float)(auVar113._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar53;
  auVar180._12_2_ = uVar103;
  auVar180._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar53;
  auVar179._10_2_ = uVar103;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar103;
  auVar178._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar32._4_8_ = auVar178._8_8_;
  auVar32._2_2_ = uVar103;
  auVar32._0_2_ = uVar103;
  fVar216 = (float)((int)sVar66 >> 8);
  fVar232 = (float)(auVar32._0_4_ >> 0x18);
  fVar236 = (float)(auVar178._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar51 + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar53;
  auVar183._12_2_ = uVar103;
  auVar183._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar53;
  auVar182._10_2_ = uVar103;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar103;
  auVar181._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar33._4_8_ = auVar181._8_8_;
  auVar33._2_2_ = uVar103;
  auVar33._0_2_ = uVar103;
  fVar254 = (float)((int)sVar66 >> 8);
  fVar267 = (float)(auVar33._0_4_ >> 0x18);
  fVar268 = (float)(auVar181._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0x1a + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar53;
  auVar186._12_2_ = uVar103;
  auVar186._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar53;
  auVar185._10_2_ = uVar103;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar103;
  auVar184._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar34._4_8_ = auVar184._8_8_;
  auVar34._2_2_ = uVar103;
  auVar34._0_2_ = uVar103;
  fVar243 = (float)((int)sVar66 >> 8);
  fVar252 = (float)(auVar34._0_4_ >> 0x18);
  fVar253 = (float)(auVar184._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0x1b + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar53;
  auVar189._12_2_ = uVar103;
  auVar189._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar53;
  auVar188._10_2_ = uVar103;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar103;
  auVar187._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar35._4_8_ = auVar187._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar270 = (float)((int)sVar66 >> 8);
  fVar280 = (float)(auVar35._0_4_ >> 0x18);
  fVar281 = (float)(auVar187._8_4_ >> 0x18);
  uVar14 = *(undefined4 *)(prim + uVar51 * 0x1c + 6);
  uVar102 = (undefined1)((uint)uVar14 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar14 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar14));
  uVar102 = (undefined1)((uint)uVar14 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar102),uVar102);
  sVar66 = CONCAT11((char)uVar14,(char)uVar14);
  uVar53 = CONCAT62(uVar27,sVar66);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar53;
  auVar192._12_2_ = uVar103;
  auVar192._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar53;
  auVar191._10_2_ = uVar103;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar103;
  auVar190._0_8_ = uVar53;
  uVar103 = (undefined2)uVar27;
  auVar36._4_8_ = auVar190._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar106 = (float)((int)sVar66 >> 8);
  fVar132 = (float)(auVar36._0_4_ >> 0x18);
  fVar133 = (float)(auVar190._8_4_ >> 0x18);
  fVar301 = fVar134 * fVar317 + fVar145 * fVar160 + fVar146 * fVar207;
  fVar311 = fVar134 * fVar322 + fVar145 * fVar172 + fVar146 * fVar211;
  fVar313 = fVar134 * fVar324 + fVar145 * fVar174 + fVar146 * fVar213;
  fVar315 = fVar134 * (float)(auVar136._12_4_ >> 0x18) +
            fVar145 * (float)(auVar108._12_4_ >> 0x18) + fVar146 * (float)(auVar111._12_4_ >> 0x18);
  fVar282 = fVar134 * fVar67 + fVar145 * fVar216 + fVar146 * fVar254;
  fVar294 = fVar134 * fVar104 + fVar145 * fVar232 + fVar146 * fVar267;
  fVar296 = fVar134 * fVar105 + fVar145 * fVar236 + fVar146 * fVar268;
  fVar298 = fVar134 * (float)(auVar114._12_4_ >> 0x18) +
            fVar145 * (float)(auVar179._12_4_ >> 0x18) + fVar146 * (float)(auVar182._12_4_ >> 0x18);
  fVar177 = fVar134 * fVar243 + fVar145 * fVar270 + fVar146 * fVar106;
  fVar203 = fVar134 * fVar252 + fVar145 * fVar280 + fVar146 * fVar132;
  fVar204 = fVar134 * fVar253 + fVar145 * fVar281 + fVar146 * fVar133;
  fVar134 = fVar134 * (float)(auVar185._12_4_ >> 0x18) +
            fVar145 * (float)(auVar188._12_4_ >> 0x18) + fVar146 * (float)(auVar191._12_4_ >> 0x18);
  fVar318 = fVar317 * fVar147 + fVar160 * fVar155 + fVar207 * fVar157;
  fVar322 = fVar322 * fVar147 + fVar172 * fVar155 + fVar211 * fVar157;
  fVar324 = fVar324 * fVar147 + fVar174 * fVar155 + fVar213 * fVar157;
  fVar325 = (float)(auVar136._12_4_ >> 0x18) * fVar147 +
            (float)(auVar108._12_4_ >> 0x18) * fVar155 + (float)(auVar111._12_4_ >> 0x18) * fVar157;
  fVar254 = fVar67 * fVar147 + fVar216 * fVar155 + fVar254 * fVar157;
  fVar267 = fVar104 * fVar147 + fVar232 * fVar155 + fVar267 * fVar157;
  fVar268 = fVar105 * fVar147 + fVar236 * fVar155 + fVar268 * fVar157;
  fVar317 = (float)(auVar114._12_4_ >> 0x18) * fVar147 +
            (float)(auVar179._12_4_ >> 0x18) * fVar155 + (float)(auVar182._12_4_ >> 0x18) * fVar157;
  fVar243 = fVar147 * fVar243 + fVar155 * fVar270 + fVar157 * fVar106;
  fVar252 = fVar147 * fVar252 + fVar155 * fVar280 + fVar157 * fVar132;
  fVar253 = fVar147 * fVar253 + fVar155 * fVar281 + fVar157 * fVar133;
  fVar270 = fVar147 * (float)(auVar185._12_4_ >> 0x18) +
            fVar155 * (float)(auVar188._12_4_ >> 0x18) + fVar157 * (float)(auVar191._12_4_ >> 0x18);
  fVar146 = (float)DAT_01f80d30;
  fVar67 = DAT_01f80d30._4_4_;
  fVar104 = DAT_01f80d30._8_4_;
  fVar105 = DAT_01f80d30._12_4_;
  uVar61 = -(uint)(fVar146 <= ABS(fVar301));
  uVar62 = -(uint)(fVar67 <= ABS(fVar311));
  uVar64 = -(uint)(fVar104 <= ABS(fVar313));
  uVar65 = -(uint)(fVar105 <= ABS(fVar315));
  auVar303._0_4_ = (uint)fVar301 & uVar61;
  auVar303._4_4_ = (uint)fVar311 & uVar62;
  auVar303._8_4_ = (uint)fVar313 & uVar64;
  auVar303._12_4_ = (uint)fVar315 & uVar65;
  auVar148._0_4_ = ~uVar61 & (uint)fVar146;
  auVar148._4_4_ = ~uVar62 & (uint)fVar67;
  auVar148._8_4_ = ~uVar64 & (uint)fVar104;
  auVar148._12_4_ = ~uVar65 & (uint)fVar105;
  auVar148 = auVar148 | auVar303;
  uVar61 = -(uint)(fVar146 <= ABS(fVar282));
  uVar62 = -(uint)(fVar67 <= ABS(fVar294));
  uVar64 = -(uint)(fVar104 <= ABS(fVar296));
  uVar65 = -(uint)(fVar105 <= ABS(fVar298));
  auVar284._0_4_ = (uint)fVar282 & uVar61;
  auVar284._4_4_ = (uint)fVar294 & uVar62;
  auVar284._8_4_ = (uint)fVar296 & uVar64;
  auVar284._12_4_ = (uint)fVar298 & uVar65;
  auVar209._0_4_ = ~uVar61 & (uint)fVar146;
  auVar209._4_4_ = ~uVar62 & (uint)fVar67;
  auVar209._8_4_ = ~uVar64 & (uint)fVar104;
  auVar209._12_4_ = ~uVar65 & (uint)fVar105;
  auVar209 = auVar209 | auVar284;
  uVar61 = -(uint)(fVar146 <= ABS(fVar177));
  uVar62 = -(uint)(fVar67 <= ABS(fVar203));
  uVar64 = -(uint)(fVar104 <= ABS(fVar204));
  uVar65 = -(uint)(fVar105 <= ABS(fVar134));
  auVar193._0_4_ = (uint)fVar177 & uVar61;
  auVar193._4_4_ = (uint)fVar203 & uVar62;
  auVar193._8_4_ = (uint)fVar204 & uVar64;
  auVar193._12_4_ = (uint)fVar134 & uVar65;
  auVar220._0_4_ = ~uVar61 & (uint)fVar146;
  auVar220._4_4_ = ~uVar62 & (uint)fVar67;
  auVar220._8_4_ = ~uVar64 & (uint)fVar104;
  auVar220._12_4_ = ~uVar65 & (uint)fVar105;
  auVar220 = auVar220 | auVar193;
  auVar68 = rcpps(_DAT_01f80d30,auVar148);
  fVar146 = auVar68._0_4_;
  fVar105 = auVar68._4_4_;
  fVar160 = auVar68._8_4_;
  fVar216 = auVar68._12_4_;
  fVar146 = (1.0 - auVar148._0_4_ * fVar146) * fVar146 + fVar146;
  fVar105 = (1.0 - auVar148._4_4_ * fVar105) * fVar105 + fVar105;
  fVar160 = (1.0 - auVar148._8_4_ * fVar160) * fVar160 + fVar160;
  fVar216 = (1.0 - auVar148._12_4_ * fVar216) * fVar216 + fVar216;
  auVar68 = rcpps(auVar68,auVar209);
  fVar67 = auVar68._0_4_;
  fVar106 = auVar68._4_4_;
  fVar172 = auVar68._8_4_;
  fVar232 = auVar68._12_4_;
  fVar67 = (1.0 - auVar209._0_4_ * fVar67) * fVar67 + fVar67;
  fVar106 = (1.0 - auVar209._4_4_ * fVar106) * fVar106 + fVar106;
  fVar172 = (1.0 - auVar209._8_4_ * fVar172) * fVar172 + fVar172;
  fVar232 = (1.0 - auVar209._12_4_ * fVar232) * fVar232 + fVar232;
  auVar68 = rcpps(auVar68,auVar220);
  fVar104 = auVar68._0_4_;
  fVar132 = auVar68._4_4_;
  fVar174 = auVar68._8_4_;
  fVar236 = auVar68._12_4_;
  fVar104 = (1.0 - auVar220._0_4_ * fVar104) * fVar104 + fVar104;
  fVar132 = (1.0 - auVar220._4_4_ * fVar132) * fVar132 + fVar132;
  fVar174 = (1.0 - auVar220._8_4_ * fVar174) * fVar174 + fVar174;
  fVar236 = (1.0 - auVar220._12_4_ * fVar236) * fVar236 + fVar236;
  fVar280 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar54 + 0x16)) *
            *(float *)(prim + lVar54 + 0x1a);
  uVar53 = *(ulong *)(prim + uVar51 * 7 + 6);
  uVar103 = (undefined2)(uVar53 >> 0x30);
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar53;
  auVar261._12_2_ = uVar103;
  auVar261._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar53 >> 0x20);
  auVar138._12_4_ = auVar261._12_4_;
  auVar138._8_2_ = 0;
  auVar138._0_8_ = uVar53;
  auVar138._10_2_ = uVar103;
  auVar69._10_6_ = auVar138._10_6_;
  auVar69._8_2_ = uVar103;
  auVar69._0_8_ = uVar53;
  uVar103 = (undefined2)(uVar53 >> 0x10);
  auVar37._4_8_ = auVar69._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  fVar133 = (float)(auVar37._0_4_ >> 0x10);
  fVar177 = (float)(auVar69._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar51 * 0xb + 6);
  uVar103 = (undefined2)(uVar52 >> 0x30);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar52;
  auVar151._12_2_ = uVar103;
  auVar151._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar52 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar52;
  auVar150._10_2_ = uVar103;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar103;
  auVar149._0_8_ = uVar52;
  uVar103 = (undefined2)(uVar52 >> 0x10);
  auVar38._4_8_ = auVar149._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  uVar5 = *(ulong *)(prim + uVar51 * 9 + 6);
  uVar103 = (undefined2)(uVar5 >> 0x30);
  auVar72._8_4_ = 0;
  auVar72._0_8_ = uVar5;
  auVar72._12_2_ = uVar103;
  auVar72._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar5 >> 0x20);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._8_2_ = 0;
  auVar71._0_8_ = uVar5;
  auVar71._10_2_ = uVar103;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._8_2_ = uVar103;
  auVar70._0_8_ = uVar5;
  uVar103 = (undefined2)(uVar5 >> 0x10);
  auVar39._4_8_ = auVar70._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  fVar134 = (float)(auVar39._0_4_ >> 0x10);
  fVar203 = (float)(auVar70._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar51 * 0xd + 6);
  uVar103 = (undefined2)(uVar6 >> 0x30);
  auVar223._8_4_ = 0;
  auVar223._0_8_ = uVar6;
  auVar223._12_2_ = uVar103;
  auVar223._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar6 >> 0x20);
  auVar222._12_4_ = auVar223._12_4_;
  auVar222._8_2_ = 0;
  auVar222._0_8_ = uVar6;
  auVar222._10_2_ = uVar103;
  auVar221._10_6_ = auVar222._10_6_;
  auVar221._8_2_ = uVar103;
  auVar221._0_8_ = uVar6;
  uVar103 = (undefined2)(uVar6 >> 0x10);
  auVar40._4_8_ = auVar221._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  uVar7 = *(ulong *)(prim + uVar51 * 0x12 + 6);
  uVar103 = (undefined2)(uVar7 >> 0x30);
  auVar75._8_4_ = 0;
  auVar75._0_8_ = uVar7;
  auVar75._12_2_ = uVar103;
  auVar75._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar7 >> 0x20);
  auVar74._12_4_ = auVar75._12_4_;
  auVar74._8_2_ = 0;
  auVar74._0_8_ = uVar7;
  auVar74._10_2_ = uVar103;
  auVar73._10_6_ = auVar74._10_6_;
  auVar73._8_2_ = uVar103;
  auVar73._0_8_ = uVar7;
  uVar103 = (undefined2)(uVar7 >> 0x10);
  auVar41._4_8_ = auVar73._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  fVar145 = (float)(auVar41._0_4_ >> 0x10);
  fVar204 = (float)(auVar73._8_4_ >> 0x10);
  uVar59 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  uVar8 = *(ulong *)(prim + uVar51 * 2 + uVar59 + 6);
  uVar103 = (undefined2)(uVar8 >> 0x30);
  auVar257._8_4_ = 0;
  auVar257._0_8_ = uVar8;
  auVar257._12_2_ = uVar103;
  auVar257._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar8 >> 0x20);
  auVar256._12_4_ = auVar257._12_4_;
  auVar256._8_2_ = 0;
  auVar256._0_8_ = uVar8;
  auVar256._10_2_ = uVar103;
  auVar255._10_6_ = auVar256._10_6_;
  auVar255._8_2_ = uVar103;
  auVar255._0_8_ = uVar8;
  uVar103 = (undefined2)(uVar8 >> 0x10);
  auVar42._4_8_ = auVar255._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  uVar59 = *(ulong *)(prim + uVar59 + 6);
  uVar103 = (undefined2)(uVar59 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar59;
  auVar78._12_2_ = uVar103;
  auVar78._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar59 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar59;
  auVar77._10_2_ = uVar103;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar103;
  auVar76._0_8_ = uVar59;
  uVar103 = (undefined2)(uVar59 >> 0x10);
  auVar43._4_8_ = auVar76._8_8_;
  auVar43._2_2_ = uVar103;
  auVar43._0_2_ = uVar103;
  fVar147 = (float)(auVar43._0_4_ >> 0x10);
  fVar207 = (float)(auVar76._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar51 * 0x18 + 6);
  uVar103 = (undefined2)(uVar9 >> 0x30);
  auVar273._8_4_ = 0;
  auVar273._0_8_ = uVar9;
  auVar273._12_2_ = uVar103;
  auVar273._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar9 >> 0x20);
  auVar272._12_4_ = auVar273._12_4_;
  auVar272._8_2_ = 0;
  auVar272._0_8_ = uVar9;
  auVar272._10_2_ = uVar103;
  auVar271._10_6_ = auVar272._10_6_;
  auVar271._8_2_ = uVar103;
  auVar271._0_8_ = uVar9;
  uVar103 = (undefined2)(uVar9 >> 0x10);
  auVar44._4_8_ = auVar271._8_8_;
  auVar44._2_2_ = uVar103;
  auVar44._0_2_ = uVar103;
  uVar10 = *(ulong *)(prim + uVar51 * 0x1d + 6);
  uVar103 = (undefined2)(uVar10 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar10;
  auVar81._12_2_ = uVar103;
  auVar81._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar10 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar10;
  auVar80._10_2_ = uVar103;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar103;
  auVar79._0_8_ = uVar10;
  uVar103 = (undefined2)(uVar10 >> 0x10);
  auVar45._4_8_ = auVar79._8_8_;
  auVar45._2_2_ = uVar103;
  auVar45._0_2_ = uVar103;
  fVar155 = (float)(auVar45._0_4_ >> 0x10);
  fVar211 = (float)(auVar79._8_4_ >> 0x10);
  uVar11 = *(ulong *)(prim + uVar51 + (ulong)(byte)PVar13 * 0x20 + 6);
  uVar103 = (undefined2)(uVar11 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar11;
  auVar287._12_2_ = uVar103;
  auVar287._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar11 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar11;
  auVar286._10_2_ = uVar103;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar103;
  auVar285._0_8_ = uVar11;
  uVar103 = (undefined2)(uVar11 >> 0x10);
  auVar46._4_8_ = auVar285._8_8_;
  auVar46._2_2_ = uVar103;
  auVar46._0_2_ = uVar103;
  uVar12 = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar51) + 6);
  uVar103 = (undefined2)(uVar12 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar12;
  auVar84._12_2_ = uVar103;
  auVar84._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar12 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar12;
  auVar83._10_2_ = uVar103;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar103;
  auVar82._0_8_ = uVar12;
  uVar103 = (undefined2)(uVar12 >> 0x10);
  auVar47._4_8_ = auVar82._8_8_;
  auVar47._2_2_ = uVar103;
  auVar47._0_2_ = uVar103;
  fVar157 = (float)(auVar47._0_4_ >> 0x10);
  fVar213 = (float)(auVar82._8_4_ >> 0x10);
  uVar51 = *(ulong *)(prim + uVar51 * 0x23 + 6);
  uVar103 = (undefined2)(uVar51 >> 0x30);
  auVar306._8_4_ = 0;
  auVar306._0_8_ = uVar51;
  auVar306._12_2_ = uVar103;
  auVar306._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar51 >> 0x20);
  auVar305._12_4_ = auVar306._12_4_;
  auVar305._8_2_ = 0;
  auVar305._0_8_ = uVar51;
  auVar305._10_2_ = uVar103;
  auVar304._10_6_ = auVar305._10_6_;
  auVar304._8_2_ = uVar103;
  auVar304._0_8_ = uVar51;
  uVar103 = (undefined2)(uVar51 >> 0x10);
  auVar48._4_8_ = auVar304._8_8_;
  auVar48._2_2_ = uVar103;
  auVar48._0_2_ = uVar103;
  auVar152._0_8_ =
       CONCAT44(((((float)(auVar38._0_4_ >> 0x10) - fVar133) * fVar280 + fVar133) - fVar322) *
                fVar105,((((float)(int)(short)uVar52 - (float)(int)(short)uVar53) * fVar280 +
                         (float)(int)(short)uVar53) - fVar318) * fVar146);
  auVar152._8_4_ =
       ((((float)(auVar149._8_4_ >> 0x10) - fVar177) * fVar280 + fVar177) - fVar324) * fVar160;
  auVar152._12_4_ =
       ((((float)(auVar150._12_4_ >> 0x10) - (float)(auVar138._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar138._12_4_ >> 0x10)) - fVar325) * fVar216;
  auVar224._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar5) * fVar280 + (float)(int)(short)uVar5)
       - fVar318) * fVar146;
  auVar224._4_4_ =
       ((((float)(auVar40._0_4_ >> 0x10) - fVar134) * fVar280 + fVar134) - fVar322) * fVar105;
  auVar224._8_4_ =
       ((((float)(auVar221._8_4_ >> 0x10) - fVar203) * fVar280 + fVar203) - fVar324) * fVar160;
  auVar224._12_4_ =
       ((((float)(auVar222._12_4_ >> 0x10) - (float)(auVar71._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar71._12_4_ >> 0x10)) - fVar325) * fVar216;
  auVar258._0_8_ =
       CONCAT44(((((float)(auVar42._0_4_ >> 0x10) - fVar145) * fVar280 + fVar145) - fVar267) *
                fVar106,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar280 +
                         (float)(int)(short)uVar7) - fVar254) * fVar67);
  auVar258._8_4_ =
       ((((float)(auVar255._8_4_ >> 0x10) - fVar204) * fVar280 + fVar204) - fVar268) * fVar172;
  auVar258._12_4_ =
       ((((float)(auVar256._12_4_ >> 0x10) - (float)(auVar74._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar74._12_4_ >> 0x10)) - fVar317) * fVar232;
  auVar274._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar59) * fVar280 +
        (float)(int)(short)uVar59) - fVar254) * fVar67;
  auVar274._4_4_ =
       ((((float)(auVar44._0_4_ >> 0x10) - fVar147) * fVar280 + fVar147) - fVar267) * fVar106;
  auVar274._8_4_ =
       ((((float)(auVar271._8_4_ >> 0x10) - fVar207) * fVar280 + fVar207) - fVar268) * fVar172;
  auVar274._12_4_ =
       ((((float)(auVar272._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar317) * fVar232;
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar288._0_8_ =
       CONCAT44(((((float)(auVar46._0_4_ >> 0x10) - fVar155) * fVar280 + fVar155) - fVar252) *
                fVar132,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar280 +
                         (float)(int)(short)uVar10) - fVar243) * fVar104);
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar211) * fVar280 + fVar211) - fVar253) * fVar174;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar270) * fVar236;
  auVar307._0_4_ =
       ((((float)(int)(short)uVar51 - (float)(int)(short)uVar12) * fVar280 +
        (float)(int)(short)uVar12) - fVar243) * fVar104;
  auVar307._4_4_ =
       ((((float)(auVar48._0_4_ >> 0x10) - fVar157) * fVar280 + fVar157) - fVar252) * fVar132;
  auVar307._8_4_ =
       ((((float)(auVar304._8_4_ >> 0x10) - fVar213) * fVar280 + fVar213) - fVar253) * fVar174;
  auVar307._12_4_ =
       ((((float)(auVar305._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar280 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar270) * fVar236;
  auVar135._8_4_ = auVar152._8_4_;
  auVar135._0_8_ = auVar152._0_8_;
  auVar135._12_4_ = auVar152._12_4_;
  auVar136 = minps(auVar135,auVar224);
  auVar116._8_4_ = auVar258._8_4_;
  auVar116._0_8_ = auVar258._0_8_;
  auVar116._12_4_ = auVar258._12_4_;
  auVar68 = minps(auVar116,auVar274);
  auVar136 = maxps(auVar136,auVar68);
  auVar117._8_4_ = auVar288._8_4_;
  auVar117._0_8_ = auVar288._0_8_;
  auVar117._12_4_ = auVar288._12_4_;
  auVar68 = minps(auVar117,auVar307);
  auVar85._4_4_ = uVar14;
  auVar85._0_4_ = uVar14;
  auVar85._8_4_ = uVar14;
  auVar85._12_4_ = uVar14;
  auVar68 = maxps(auVar68,auVar85);
  auVar68 = maxps(auVar136,auVar68);
  auVar136 = maxps(auVar152,auVar224);
  auVar259 = maxps(auVar258,auVar274);
  auVar136 = minps(auVar136,auVar259);
  local_288 = auVar68._0_4_ * 0.99999964;
  fStack_284 = auVar68._4_4_ * 0.99999964;
  fStack_280 = auVar68._8_4_ * 0.99999964;
  fStack_27c = auVar68._12_4_ * 0.99999964;
  auVar68 = maxps(auVar288,auVar307);
  uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar86._4_4_ = uVar14;
  auVar86._0_4_ = uVar14;
  auVar86._8_4_ = uVar14;
  auVar86._12_4_ = uVar14;
  auVar68 = minps(auVar68,auVar86);
  auVar68 = minps(auVar136,auVar68);
  uVar61 = (uint)(byte)PVar13;
  auVar118._0_4_ = -(uint)(uVar61 != 0 && local_288 <= auVar68._0_4_ * 1.0000004);
  auVar118._4_4_ = -(uint)(1 < uVar61 && fStack_284 <= auVar68._4_4_ * 1.0000004);
  auVar118._8_4_ = -(uint)(2 < uVar61 && fStack_280 <= auVar68._8_4_ * 1.0000004);
  auVar118._12_4_ = -(uint)(3 < uVar61 && fStack_27c <= auVar68._12_4_ * 1.0000004);
  uVar61 = movmskps(uVar61,auVar118);
  if (uVar61 == 0) {
    return false;
  }
  uVar61 = uVar61 & 0xff;
  local_390 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_268._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_268._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_268._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_268._12_4_ = 0;
  local_388 = prim;
LAB_00b154bb:
  uVar53 = (ulong)uVar61;
  lVar54 = 0;
  if (uVar53 != 0) {
    for (; (uVar61 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
    }
  }
  uVar62 = *(uint *)(local_388 + 2);
  uVar64 = *(uint *)(local_388 + lVar54 * 4 + 6);
  pGVar15 = (context->scene->geometries).items[uVar62].ptr;
  fVar146 = pGVar15->fnumTimeSegments;
  fVar67 = (pGVar15->time_range).lower;
  fVar104 = ((*(float *)(ray + k * 4 + 0x70) - fVar67) / ((pGVar15->time_range).upper - fVar67)) *
            fVar146;
  fVar67 = floorf(fVar104);
  fVar146 = fVar146 + -1.0;
  if (fVar146 <= fVar67) {
    fVar67 = fVar146;
  }
  fVar146 = 0.0;
  if (0.0 <= fVar67) {
    fVar146 = fVar67;
  }
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                           (ulong)uVar64 *
                           pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var16 = pGVar15[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar58 = (long)(int)fVar146 * 0x38;
  lVar17 = *(long *)(_Var16 + lVar58);
  lVar18 = *(long *)(_Var16 + 0x10 + lVar58);
  pfVar3 = (float *)(lVar17 + lVar18 * uVar52);
  fVar67 = *pfVar3;
  fVar105 = pfVar3[1];
  fVar106 = pfVar3[2];
  fVar132 = pfVar3[3];
  lVar54 = uVar52 + 1;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar54);
  fVar133 = *pfVar3;
  fVar134 = pfVar3[1];
  fVar145 = pfVar3[2];
  fVar147 = pfVar3[3];
  lVar1 = uVar52 + 2;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar1);
  fVar155 = *pfVar3;
  fVar157 = pfVar3[1];
  fVar160 = pfVar3[2];
  fVar172 = pfVar3[3];
  lVar2 = uVar52 + 3;
  pfVar3 = (float *)(lVar17 + lVar18 * lVar2);
  fVar174 = *pfVar3;
  fVar177 = pfVar3[1];
  fVar203 = pfVar3[2];
  fVar204 = pfVar3[3];
  lVar17 = *(long *)&pGVar15[4].fnumTimeSegments;
  lVar18 = *(long *)(lVar17 + lVar58);
  lVar19 = *(long *)(lVar17 + 0x10 + lVar58);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar52);
  fVar207 = *pfVar3;
  fVar211 = pfVar3[1];
  fVar213 = pfVar3[2];
  fVar216 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar54);
  fVar232 = *pfVar3;
  fVar236 = pfVar3[1];
  fVar254 = pfVar3[2];
  fVar267 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar268 = *pfVar3;
  fVar317 = pfVar3[1];
  fVar243 = pfVar3[2];
  fVar252 = pfVar3[3];
  fVar104 = fVar104 - fVar146;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar146 = *pfVar3;
  fVar253 = pfVar3[1];
  fVar270 = pfVar3[2];
  fVar280 = pfVar3[3];
  fVar281 = fVar67 * 0.16666667 + fVar133 * 0.6666667 + fVar155 * 0.16666667 + fVar174 * 0.0;
  fVar294 = fVar105 * 0.16666667 + fVar134 * 0.6666667 + fVar157 * 0.16666667 + fVar177 * 0.0;
  fVar298 = fVar106 * 0.16666667 + fVar145 * 0.6666667 + fVar160 * 0.16666667 + fVar203 * 0.0;
  fVar311 = fVar132 * 0.16666667 + fVar147 * 0.6666667 + fVar172 * 0.16666667 + fVar204 * 0.0;
  fVar325 = ((fVar155 * 0.5 + fVar174 * 0.0) - fVar133 * 0.0) - fVar67 * 0.5;
  fVar156 = ((fVar157 * 0.5 + fVar177 * 0.0) - fVar134 * 0.0) - fVar105 * 0.5;
  fVar158 = ((fVar160 * 0.5 + fVar203 * 0.0) - fVar145 * 0.0) - fVar106 * 0.5;
  fVar159 = ((fVar172 * 0.5 + fVar204 * 0.0) - fVar147 * 0.0) - fVar132 * 0.5;
  fVar313 = fVar207 * 0.16666667 + fVar232 * 0.6666667 + fVar268 * 0.16666667 + fVar146 * 0.0;
  fVar312 = fVar211 * 0.16666667 + fVar236 * 0.6666667 + fVar317 * 0.16666667 + fVar253 * 0.0;
  fVar314 = fVar213 * 0.16666667 + fVar254 * 0.6666667 + fVar243 * 0.16666667 + fVar270 * 0.0;
  fVar316 = fVar216 * 0.16666667 + fVar267 * 0.6666667 + fVar252 * 0.16666667 + fVar280 * 0.0;
  fVar282 = ((fVar268 * 0.5 + fVar146 * 0.0) - fVar232 * 0.0) - fVar207 * 0.5;
  fVar296 = ((fVar317 * 0.5 + fVar253 * 0.0) - fVar236 * 0.0) - fVar211 * 0.5;
  fVar301 = ((fVar243 * 0.5 + fVar270 * 0.0) - fVar254 * 0.0) - fVar213 * 0.5;
  fVar299 = ((fVar252 * 0.5 + fVar280 * 0.0) - fVar267 * 0.0) - fVar216 * 0.5;
  fVar161 = fVar133 * 0.16666667 + fVar155 * 0.6666667 + fVar174 * 0.16666667 + fVar67 * 0.0;
  fVar173 = fVar134 * 0.16666667 + fVar157 * 0.6666667 + fVar177 * 0.16666667 + fVar105 * 0.0;
  fVar175 = fVar145 * 0.16666667 + fVar160 * 0.6666667 + fVar203 * 0.16666667 + fVar106 * 0.0;
  fVar176 = fVar147 * 0.16666667 + fVar172 * 0.6666667 + fVar204 * 0.16666667 + fVar132 * 0.0;
  fVar315 = ((fVar155 * 0.0 + fVar174 * 0.5) - fVar133 * 0.5) - fVar67 * 0.0;
  fVar318 = ((fVar157 * 0.0 + fVar177 * 0.5) - fVar134 * 0.5) - fVar105 * 0.0;
  fVar322 = ((fVar160 * 0.0 + fVar203 * 0.5) - fVar145 * 0.5) - fVar106 * 0.0;
  fVar324 = ((fVar172 * 0.0 + fVar204 * 0.5) - fVar147 * 0.5) - fVar132 * 0.0;
  fVar106 = fVar232 * 0.16666667 + fVar268 * 0.6666667 + fVar146 * 0.16666667 + fVar207 * 0.0;
  fVar132 = fVar236 * 0.16666667 + fVar317 * 0.6666667 + fVar253 * 0.16666667 + fVar211 * 0.0;
  fVar133 = fVar254 * 0.16666667 + fVar243 * 0.6666667 + fVar270 * 0.16666667 + fVar213 * 0.0;
  fVar134 = fVar267 * 0.16666667 + fVar252 * 0.6666667 + fVar280 * 0.16666667 + fVar216 * 0.0;
  fVar146 = ((fVar268 * 0.0 + fVar146 * 0.5) - fVar232 * 0.5) - fVar207 * 0.0;
  fVar67 = ((fVar317 * 0.0 + fVar253 * 0.5) - fVar236 * 0.5) - fVar211 * 0.0;
  fVar105 = ((fVar243 * 0.0 + fVar270 * 0.5) - fVar254 * 0.5) - fVar213 * 0.0;
  fVar207 = ((fVar252 * 0.0 + fVar280 * 0.5) - fVar267 * 0.5) - fVar216 * 0.0;
  fVar319 = fVar156 * fVar313 - fVar312 * fVar325;
  fVar323 = fVar158 * fVar312 - fVar314 * fVar156;
  fVar314 = fVar325 * fVar314 - fVar313 * fVar158;
  fVar326 = fVar159 * fVar316 - fVar316 * fVar159;
  fVar216 = fVar156 * fVar282 - fVar296 * fVar325;
  fVar236 = fVar158 * fVar296 - fVar301 * fVar156;
  fVar254 = fVar325 * fVar301 - fVar282 * fVar158;
  fVar243 = fVar318 * fVar106 - fVar132 * fVar315;
  fVar252 = fVar322 * fVar132 - fVar133 * fVar318;
  fVar253 = fVar315 * fVar133 - fVar106 * fVar322;
  fVar270 = fVar324 * fVar134 - fVar134 * fVar324;
  fVar267 = fVar318 * fVar146 - fVar67 * fVar315;
  fVar268 = fVar322 * fVar67 - fVar105 * fVar318;
  fVar317 = fVar315 * fVar105 - fVar146 * fVar322;
  fVar204 = fVar314 * fVar314 + fVar323 * fVar323 + fVar319 * fVar319;
  auVar68 = ZEXT416((uint)fVar204);
  auVar136 = rsqrtss(ZEXT416((uint)fVar204),auVar68);
  fVar146 = auVar136._0_4_;
  fVar280 = fVar146 * 1.5 - fVar146 * fVar146 * fVar204 * 0.5 * fVar146;
  fVar312 = fVar319 * fVar216 + fVar314 * fVar254 + fVar323 * fVar236;
  fVar213 = fVar326 * fVar280;
  auVar68 = rcpss(auVar68,auVar68);
  fVar232 = (2.0 - fVar204 * auVar68._0_4_) * auVar68._0_4_;
  fVar302 = fVar253 * fVar253 + fVar252 * fVar252 + fVar243 * fVar243;
  auVar136 = ZEXT416((uint)fVar302);
  auVar68 = rsqrtss(ZEXT416((uint)fVar302),auVar136);
  fVar146 = auVar68._0_4_;
  fVar316 = fVar146 * 1.5 - fVar146 * fVar146 * fVar302 * 0.5 * fVar146;
  fVar327 = fVar243 * fVar267 + fVar253 * fVar317 + fVar252 * fVar268;
  lVar18 = *(long *)(_Var16 + 0x38 + lVar58);
  lVar19 = *(long *)(_Var16 + 0x48 + lVar58);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar52);
  fVar146 = *pfVar3;
  fVar67 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar54);
  fVar132 = *pfVar3;
  fVar133 = pfVar3[1];
  fVar134 = pfVar3[2];
  fVar145 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar19 * lVar1);
  fVar147 = *pfVar3;
  fVar155 = pfVar3[1];
  fVar157 = pfVar3[2];
  fVar160 = pfVar3[3];
  auVar68 = rcpss(auVar136,auVar136);
  pfVar3 = (float *)(lVar18 + lVar19 * lVar2);
  fVar172 = *pfVar3;
  fVar174 = pfVar3[1];
  fVar177 = pfVar3[2];
  fVar203 = pfVar3[3];
  lVar18 = *(long *)(lVar17 + 0x38 + lVar58);
  lVar17 = *(long *)(lVar17 + 0x48 + lVar58);
  fVar211 = fVar270 * fVar316;
  fVar328 = (2.0 - fVar302 * auVar68._0_4_) * auVar68._0_4_;
  fVar282 = fVar311 * fVar323 * fVar280;
  fVar296 = fVar311 * fVar314 * fVar280;
  fVar301 = fVar311 * fVar319 * fVar280;
  fVar313 = fVar311 * fVar213;
  fVar208 = fVar281 - fVar282;
  fVar212 = fVar294 - fVar296;
  fVar214 = fVar298 - fVar301;
  fVar215 = fVar311 - fVar313;
  fVar283 = fVar311 * fVar232 * (fVar204 * fVar236 - fVar312 * fVar323) * fVar280 +
            fVar159 * fVar323 * fVar280;
  fVar295 = fVar311 * fVar232 * (fVar204 * fVar254 - fVar312 * fVar314) * fVar280 +
            fVar159 * fVar314 * fVar280;
  fVar297 = fVar311 * fVar232 * (fVar204 * fVar216 - fVar312 * fVar319) * fVar280 +
            fVar159 * fVar319 * fVar280;
  fVar300 = fVar311 * fVar232 * (fVar204 * (fVar159 * fVar299 - fVar299 * fVar159) -
                                fVar312 * fVar326) * fVar280 + fVar159 * fVar213;
  fVar282 = fVar282 + fVar281;
  fVar296 = fVar296 + fVar294;
  fVar301 = fVar301 + fVar298;
  fVar313 = fVar313 + fVar311;
  fVar281 = fVar176 * fVar252 * fVar316;
  fVar294 = fVar176 * fVar253 * fVar316;
  fVar298 = fVar176 * fVar243 * fVar316;
  fVar311 = fVar176 * fVar211;
  fVar217 = fVar161 - fVar281;
  fVar233 = fVar173 - fVar294;
  fVar237 = fVar175 - fVar298;
  fVar240 = fVar176 - fVar311;
  fVar299 = fVar176 * fVar328 * (fVar302 * fVar268 - fVar327 * fVar252) * fVar316 +
            fVar324 * fVar252 * fVar316;
  fVar312 = fVar176 * fVar328 * (fVar302 * fVar317 - fVar327 * fVar253) * fVar316 +
            fVar324 * fVar253 * fVar316;
  fVar314 = fVar176 * fVar328 * (fVar302 * fVar267 - fVar327 * fVar243) * fVar316 +
            fVar324 * fVar243 * fVar316;
  fVar316 = fVar176 * fVar328 * (fVar302 * (fVar324 * fVar207 - fVar207 * fVar324) -
                                fVar327 * fVar270) * fVar316 + fVar324 * fVar211;
  fVar281 = fVar281 + fVar161;
  fVar294 = fVar294 + fVar173;
  fVar298 = fVar298 + fVar175;
  fVar311 = fVar311 + fVar176;
  fVar218 = fVar146 * 0.16666667 + fVar132 * 0.6666667 + fVar147 * 0.16666667 + fVar172 * 0.0;
  fVar234 = fVar67 * 0.16666667 + fVar133 * 0.6666667 + fVar155 * 0.16666667 + fVar174 * 0.0;
  fVar238 = fVar105 * 0.16666667 + fVar134 * 0.6666667 + fVar157 * 0.16666667 + fVar177 * 0.0;
  fVar241 = fVar106 * 0.16666667 + fVar145 * 0.6666667 + fVar160 * 0.16666667 + fVar203 * 0.0;
  fVar161 = ((fVar147 * 0.5 + fVar172 * 0.0) - fVar132 * 0.0) - fVar146 * 0.5;
  fVar173 = ((fVar155 * 0.5 + fVar174 * 0.0) - fVar133 * 0.0) - fVar67 * 0.5;
  fVar175 = ((fVar157 * 0.5 + fVar177 * 0.0) - fVar134 * 0.0) - fVar105 * 0.5;
  fVar176 = ((fVar160 * 0.5 + fVar203 * 0.0) - fVar145 * 0.0) - fVar106 * 0.5;
  pfVar3 = (float *)(lVar18 + lVar17 * lVar2);
  fVar204 = *pfVar3;
  fVar207 = pfVar3[1];
  fVar211 = pfVar3[2];
  fVar213 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar1 * lVar17);
  fVar216 = *pfVar3;
  fVar232 = pfVar3[1];
  fVar236 = pfVar3[2];
  fVar254 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + lVar54 * lVar17);
  fVar267 = *pfVar3;
  fVar268 = pfVar3[1];
  fVar317 = pfVar3[2];
  fVar243 = pfVar3[3];
  pfVar3 = (float *)(lVar18 + uVar52 * lVar17);
  fVar252 = *pfVar3;
  fVar253 = pfVar3[1];
  fVar270 = pfVar3[2];
  fVar280 = pfVar3[3];
  fVar219 = fVar252 * 0.16666667 + fVar267 * 0.6666667 + fVar216 * 0.16666667 + fVar204 * 0.0;
  fVar235 = fVar253 * 0.16666667 + fVar268 * 0.6666667 + fVar232 * 0.16666667 + fVar207 * 0.0;
  fVar239 = fVar270 * 0.16666667 + fVar317 * 0.6666667 + fVar236 * 0.16666667 + fVar211 * 0.0;
  fVar242 = fVar280 * 0.16666667 + fVar243 * 0.6666667 + fVar254 * 0.16666667 + fVar213 * 0.0;
  fVar327 = ((fVar216 * 0.5 + fVar204 * 0.0) - fVar267 * 0.0) - fVar252 * 0.5;
  fVar328 = ((fVar232 * 0.5 + fVar207 * 0.0) - fVar268 * 0.0) - fVar253 * 0.5;
  fVar205 = ((fVar236 * 0.5 + fVar211 * 0.0) - fVar317 * 0.0) - fVar270 * 0.5;
  fVar206 = ((fVar254 * 0.5 + fVar213 * 0.0) - fVar243 * 0.0) - fVar280 * 0.5;
  fVar302 = fVar132 * 0.16666667 + fVar147 * 0.6666667 + fVar172 * 0.16666667 + fVar146 * 0.0;
  fVar319 = fVar133 * 0.16666667 + fVar155 * 0.6666667 + fVar174 * 0.16666667 + fVar67 * 0.0;
  fVar323 = fVar134 * 0.16666667 + fVar157 * 0.6666667 + fVar177 * 0.16666667 + fVar105 * 0.0;
  fVar326 = fVar145 * 0.16666667 + fVar160 * 0.6666667 + fVar203 * 0.16666667 + fVar106 * 0.0;
  fVar132 = ((fVar147 * 0.0 + fVar172 * 0.5) - fVar132 * 0.5) - fVar146 * 0.0;
  fVar147 = ((fVar155 * 0.0 + fVar174 * 0.5) - fVar133 * 0.5) - fVar67 * 0.0;
  fVar157 = ((fVar157 * 0.0 + fVar177 * 0.5) - fVar134 * 0.5) - fVar105 * 0.0;
  fVar172 = ((fVar160 * 0.0 + fVar203 * 0.5) - fVar145 * 0.5) - fVar106 * 0.0;
  fVar133 = fVar267 * 0.16666667 + fVar216 * 0.6666667 + fVar204 * 0.16666667 + fVar252 * 0.0;
  fVar134 = fVar268 * 0.16666667 + fVar232 * 0.6666667 + fVar207 * 0.16666667 + fVar253 * 0.0;
  fVar145 = fVar317 * 0.16666667 + fVar236 * 0.6666667 + fVar211 * 0.16666667 + fVar270 * 0.0;
  fVar269 = fVar243 * 0.16666667 + fVar254 * 0.6666667 + fVar213 * 0.16666667 + fVar280 * 0.0;
  fVar146 = ((fVar216 * 0.0 + fVar204 * 0.5) - fVar267 * 0.5) - fVar252 * 0.0;
  fVar67 = ((fVar232 * 0.0 + fVar207 * 0.5) - fVar268 * 0.5) - fVar253 * 0.0;
  fVar105 = ((fVar236 * 0.0 + fVar211 * 0.5) - fVar317 * 0.5) - fVar270 * 0.0;
  fVar155 = ((fVar254 * 0.0 + fVar213 * 0.5) - fVar243 * 0.5) - fVar280 * 0.0;
  fVar213 = fVar173 * fVar219 - fVar235 * fVar161;
  fVar207 = fVar175 * fVar235 - fVar239 * fVar173;
  fVar211 = fVar161 * fVar239 - fVar219 * fVar175;
  fVar216 = fVar176 * fVar242 - fVar242 * fVar176;
  fVar106 = fVar173 * fVar327 - fVar328 * fVar161;
  fVar174 = fVar175 * fVar328 - fVar205 * fVar173;
  fVar203 = fVar161 * fVar205 - fVar327 * fVar175;
  fVar160 = fVar147 * fVar133 - fVar134 * fVar132;
  fVar177 = fVar157 * fVar134 - fVar145 * fVar147;
  fVar204 = fVar132 * fVar145 - fVar133 * fVar157;
  fVar317 = fVar172 * fVar269 - fVar269 * fVar172;
  fVar133 = fVar147 * fVar146 - fVar67 * fVar132;
  fVar134 = fVar157 * fVar67 - fVar105 * fVar147;
  fVar145 = fVar132 * fVar105 - fVar146 * fVar157;
  fVar146 = fVar211 * fVar211 + fVar207 * fVar207 + fVar213 * fVar213;
  auVar68 = ZEXT416((uint)fVar146);
  auVar136 = rsqrtss(ZEXT416((uint)fVar146),auVar68);
  fVar67 = auVar136._0_4_;
  fVar268 = fVar67 * 1.5 - fVar67 * fVar67 * fVar146 * 0.5 * fVar67;
  fVar243 = fVar213 * fVar106 + fVar211 * fVar203 + fVar207 * fVar174;
  auVar68 = rcpss(auVar68,auVar68);
  fVar67 = (2.0 - fVar146 * auVar68._0_4_) * auVar68._0_4_;
  fVar105 = fVar216 * fVar268;
  fVar252 = fVar204 * fVar204 + fVar177 * fVar177 + fVar160 * fVar160;
  auVar68 = ZEXT416((uint)fVar252);
  auVar136 = rsqrtss(ZEXT416((uint)fVar252),auVar68);
  fVar232 = auVar136._0_4_;
  fVar328 = fVar232 * 1.5 - fVar232 * fVar232 * fVar252 * 0.5 * fVar232;
  fVar205 = fVar160 * fVar133 + fVar204 * fVar145 + fVar177 * fVar134;
  auVar68 = rcpss(auVar68,auVar68);
  fVar219 = (2.0 - fVar252 * auVar68._0_4_) * auVar68._0_4_;
  fVar270 = fVar317 * fVar328;
  fVar232 = fVar241 * fVar207 * fVar268;
  fVar236 = fVar241 * fVar211 * fVar268;
  fVar254 = fVar241 * fVar213 * fVar268;
  fVar267 = fVar241 * fVar105;
  fVar207 = fVar241 * fVar67 * (fVar146 * fVar174 - fVar243 * fVar207) * fVar268 +
            fVar176 * fVar207 * fVar268;
  fVar211 = fVar241 * fVar67 * (fVar146 * fVar203 - fVar243 * fVar211) * fVar268 +
            fVar176 * fVar211 * fVar268;
  fVar213 = fVar241 * fVar67 * (fVar146 * fVar106 - fVar243 * fVar213) * fVar268 +
            fVar176 * fVar213 * fVar268;
  fVar216 = fVar241 * fVar67 * (fVar146 * (fVar176 * fVar206 - fVar206 * fVar176) -
                               fVar243 * fVar216) * fVar268 + fVar176 * fVar105;
  fVar174 = fVar218 - fVar232;
  fVar203 = fVar234 - fVar236;
  fVar268 = fVar238 - fVar254;
  fVar243 = fVar241 - fVar267;
  fVar232 = fVar232 + fVar218;
  fVar236 = fVar236 + fVar234;
  fVar254 = fVar254 + fVar238;
  fVar267 = fVar267 + fVar241;
  fVar146 = fVar326 * fVar177 * fVar328;
  fVar67 = fVar326 * fVar204 * fVar328;
  fVar105 = fVar326 * fVar160 * fVar328;
  fVar106 = fVar326 * fVar270;
  fVar253 = fVar326 * fVar219 * (fVar252 * fVar134 - fVar205 * fVar177) * fVar328 +
            fVar172 * fVar177 * fVar328;
  fVar280 = fVar326 * fVar219 * (fVar252 * fVar145 - fVar205 * fVar204) * fVar328 +
            fVar172 * fVar204 * fVar328;
  fVar327 = fVar326 * fVar219 * (fVar252 * fVar133 - fVar205 * fVar160) * fVar328 +
            fVar172 * fVar160 * fVar328;
  fVar328 = fVar326 * fVar219 * (fVar252 * (fVar172 * fVar155 - fVar155 * fVar172) -
                                fVar205 * fVar317) * fVar328 + fVar172 * fVar270;
  fVar133 = fVar302 - fVar146;
  fVar134 = fVar319 - fVar67;
  fVar145 = fVar323 - fVar105;
  fVar155 = fVar326 - fVar106;
  fVar146 = fVar146 + fVar302;
  fVar67 = fVar67 + fVar319;
  fVar105 = fVar105 + fVar323;
  fVar106 = fVar106 + fVar326;
  fVar270 = 1.0 - fVar104;
  fVar302 = fVar208 * fVar270 + fVar174 * fVar104;
  fVar319 = fVar212 * fVar270 + fVar203 * fVar104;
  fVar323 = fVar214 * fVar270 + fVar268 * fVar104;
  fVar326 = fVar215 * fVar270 + fVar243 * fVar104;
  fVar205 = ((fVar325 - fVar283) * 0.33333334 + fVar208) * fVar270 +
            ((fVar161 - fVar207) * 0.33333334 + fVar174) * fVar104;
  fVar206 = ((fVar156 - fVar295) * 0.33333334 + fVar212) * fVar270 +
            ((fVar173 - fVar211) * 0.33333334 + fVar203) * fVar104;
  fVar208 = ((fVar158 - fVar297) * 0.33333334 + fVar214) * fVar270 +
            ((fVar175 - fVar213) * 0.33333334 + fVar268) * fVar104;
  fVar212 = ((fVar159 - fVar300) * 0.33333334 + fVar215) * fVar270 +
            ((fVar176 - fVar216) * 0.33333334 + fVar243) * fVar104;
  fVar268 = (fVar217 - (fVar315 - fVar299) * 0.33333334) * fVar270 +
            (fVar133 - (fVar132 - fVar253) * 0.33333334) * fVar104;
  fVar317 = (fVar233 - (fVar318 - fVar312) * 0.33333334) * fVar270 +
            (fVar134 - (fVar147 - fVar280) * 0.33333334) * fVar104;
  fVar243 = (fVar237 - (fVar322 - fVar314) * 0.33333334) * fVar270 +
            (fVar145 - (fVar157 - fVar327) * 0.33333334) * fVar104;
  fVar252 = (fVar240 - (fVar324 - fVar316) * 0.33333334) * fVar270 +
            (fVar155 - (fVar172 - fVar328) * 0.33333334) * fVar104;
  fVar174 = fVar217 * fVar270 + fVar133 * fVar104;
  fVar177 = fVar233 * fVar270 + fVar134 * fVar104;
  fVar203 = fVar237 * fVar270 + fVar145 * fVar104;
  fVar204 = fVar240 * fVar270 + fVar155 * fVar104;
  fVar133 = fVar282 * fVar270 + fVar232 * fVar104;
  fVar145 = fVar296 * fVar270 + fVar236 * fVar104;
  fVar155 = fVar301 * fVar270 + fVar254 * fVar104;
  fVar160 = fVar313 * fVar270 + fVar267 * fVar104;
  fVar232 = ((fVar283 + fVar325) * 0.33333334 + fVar282) * fVar270 +
            ((fVar207 + fVar161) * 0.33333334 + fVar232) * fVar104;
  fVar236 = ((fVar295 + fVar156) * 0.33333334 + fVar296) * fVar270 +
            ((fVar211 + fVar173) * 0.33333334 + fVar236) * fVar104;
  fVar254 = ((fVar297 + fVar158) * 0.33333334 + fVar301) * fVar270 +
            ((fVar213 + fVar175) * 0.33333334 + fVar254) * fVar104;
  fVar267 = ((fVar300 + fVar159) * 0.33333334 + fVar313) * fVar270 +
            ((fVar216 + fVar176) * 0.33333334 + fVar267) * fVar104;
  fVar134 = (fVar281 - (fVar299 + fVar315) * 0.33333334) * fVar270 +
            (fVar146 - (fVar253 + fVar132) * 0.33333334) * fVar104;
  fVar147 = (fVar294 - (fVar312 + fVar318) * 0.33333334) * fVar270 +
            (fVar67 - (fVar280 + fVar147) * 0.33333334) * fVar104;
  fVar157 = (fVar298 - (fVar314 + fVar322) * 0.33333334) * fVar270 +
            (fVar105 - (fVar327 + fVar157) * 0.33333334) * fVar104;
  fVar172 = (fVar311 - (fVar316 + fVar324) * 0.33333334) * fVar270 +
            (fVar106 - (fVar328 + fVar172) * 0.33333334) * fVar104;
  local_278 = fVar270 * fVar281 + fVar104 * fVar146;
  fStack_274 = fVar270 * fVar294 + fVar104 * fVar67;
  fStack_270 = fVar270 * fVar298 + fVar104 * fVar105;
  fStack_26c = fVar270 * fVar311 + fVar104 * fVar106;
  local_1b8 = *(float *)(ray + k * 4);
  fStack_1b4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1b0 = *(float *)(ray + k * 4 + 0x20);
  local_148 = fVar302 - local_1b8;
  fStack_144 = fVar319 - fStack_1b4;
  fStack_140 = fVar323 - fStack_1b0;
  fStack_13c = fVar326 - 0.0;
  fVar146 = pre->ray_space[k].vx.field_0.m128[0];
  fVar67 = pre->ray_space[k].vx.field_0.m128[1];
  fVar104 = pre->ray_space[k].vy.field_0.m128[0];
  fVar105 = pre->ray_space[k].vy.field_0.m128[1];
  fVar106 = pre->ray_space[k].vz.field_0.m128[0];
  fVar132 = pre->ray_space[k].vz.field_0.m128[1];
  fVar253 = local_148 * fVar146 + fStack_144 * fVar104 + fStack_140 * fVar106;
  fVar270 = local_148 * fVar67 + fStack_144 * fVar105 + fStack_140 * fVar132;
  auVar87._4_4_ = fVar270;
  auVar87._0_4_ = fVar253;
  local_158 = fVar205 - local_1b8;
  fStack_154 = fVar206 - fStack_1b4;
  fStack_150 = fVar208 - fStack_1b0;
  fStack_14c = fVar212 - 0.0;
  fVar301 = local_158 * fVar146 + fStack_154 * fVar104 + fStack_150 * fVar106;
  fVar311 = local_158 * fVar67 + fStack_154 * fVar105 + fStack_150 * fVar132;
  auVar289._4_4_ = fVar311;
  auVar289._0_4_ = fVar301;
  local_168 = fVar268 - local_1b8;
  fStack_164 = fVar317 - fStack_1b4;
  fStack_160 = fVar243 - fStack_1b0;
  fStack_15c = fVar252 - 0.0;
  fVar213 = local_168 * fVar146 + fStack_164 * fVar104 + fStack_160 * fVar106;
  fVar216 = local_168 * fVar67 + fStack_164 * fVar105 + fStack_160 * fVar132;
  local_338 = CONCAT44(fVar216,fVar213);
  local_178 = fVar174 - local_1b8;
  fStack_174 = fVar177 - fStack_1b4;
  fStack_170 = fVar203 - fStack_1b0;
  fStack_16c = fVar204 - 0.0;
  fVar207 = local_178 * fVar146 + fStack_174 * fVar104 + fStack_170 * fVar106;
  fVar211 = local_178 * fVar67 + fStack_174 * fVar105 + fStack_170 * fVar132;
  auVar244._4_4_ = fVar211;
  auVar244._0_4_ = fVar207;
  local_188 = fVar133 - local_1b8;
  fStack_184 = fVar145 - fStack_1b4;
  fStack_180 = fVar155 - fStack_1b0;
  fStack_17c = fVar160 - 0.0;
  fVar282 = local_188 * fVar146 + fStack_184 * fVar104 + fStack_180 * fVar106;
  fVar294 = local_188 * fVar67 + fStack_184 * fVar105 + fStack_180 * fVar132;
  local_198 = fVar232 - local_1b8;
  fStack_194 = fVar236 - fStack_1b4;
  fStack_190 = fVar254 - fStack_1b0;
  fStack_18c = fVar267 - 0.0;
  fVar296 = local_198 * fVar146 + fStack_194 * fVar104 + fStack_190 * fVar106;
  fVar298 = local_198 * fVar67 + fStack_194 * fVar105 + fStack_190 * fVar132;
  auVar289._12_4_ = fVar298;
  auVar289._8_4_ = fVar296;
  local_1a8 = fVar134 - local_1b8;
  fStack_1a4 = fVar147 - fStack_1b4;
  fStack_1a0 = fVar157 - fStack_1b0;
  fStack_19c = fVar172 - 0.0;
  fVar280 = local_1a8 * fVar146 + fStack_1a4 * fVar104 + fStack_1a0 * fVar106;
  fVar281 = local_1a8 * fVar67 + fStack_1a4 * fVar105 + fStack_1a0 * fVar132;
  local_1b8 = local_278 - local_1b8;
  fStack_1b4 = fStack_274 - fStack_1b4;
  fStack_1b0 = fStack_270 - fStack_1b0;
  fStack_1ac = fStack_26c - 0.0;
  fVar104 = local_1b8 * fVar146 + fStack_1b4 * fVar104 + fStack_1b0 * fVar106;
  fVar67 = local_1b8 * fVar67 + fStack_1b4 * fVar105 + fStack_1b0 * fVar132;
  auVar244._12_4_ = fVar67;
  auVar244._8_4_ = fVar104;
  auVar87._8_4_ = fVar282;
  auVar87._12_4_ = fVar294;
  auVar68 = minps(auVar87,auVar289);
  auVar119._8_4_ = fVar280;
  auVar119._0_8_ = local_338;
  auVar119._12_4_ = fVar281;
  auVar136 = minps(auVar119,auVar244);
  auVar68 = minps(auVar68,auVar136);
  auVar120._4_4_ = fVar270;
  auVar120._0_4_ = fVar253;
  auVar120._8_4_ = fVar282;
  auVar120._12_4_ = fVar294;
  auVar136 = maxps(auVar120,auVar289);
  auVar137._4_4_ = fVar216;
  auVar137._0_4_ = fVar213;
  auVar137._8_4_ = fVar280;
  auVar137._12_4_ = fVar281;
  auVar138 = maxps(auVar137,auVar244);
  auVar259 = maxps(auVar136,auVar138);
  auVar20._4_8_ = auVar138._8_8_;
  auVar20._0_4_ = auVar68._4_4_;
  auVar139._0_8_ = auVar20._0_8_ << 0x20;
  auVar139._8_4_ = auVar68._8_4_;
  auVar139._12_4_ = auVar68._12_4_;
  auVar140._8_8_ = auVar68._8_8_;
  auVar140._0_8_ = auVar139._8_8_;
  auVar136 = minps(auVar68,auVar140);
  auVar21._4_8_ = auVar68._8_8_;
  auVar21._0_4_ = auVar259._4_4_;
  auVar141._0_8_ = auVar21._0_8_ << 0x20;
  auVar141._8_4_ = auVar259._8_4_;
  auVar141._12_4_ = auVar259._12_4_;
  auVar142._8_8_ = auVar259._8_8_;
  auVar142._0_8_ = auVar141._8_8_;
  auVar68 = maxps(auVar259,auVar142);
  auVar88._0_8_ = auVar136._0_8_ & 0x7fffffff7fffffff;
  auVar88._8_4_ = auVar136._8_4_ & 0x7fffffff;
  auVar88._12_4_ = auVar136._12_4_ & 0x7fffffff;
  auVar121._0_8_ = auVar68._0_8_ & 0x7fffffff7fffffff;
  auVar121._8_4_ = auVar68._8_4_ & 0x7fffffff;
  auVar121._12_4_ = auVar68._12_4_ & 0x7fffffff;
  auVar68 = maxps(auVar88,auVar121);
  fVar146 = auVar68._4_4_;
  if (auVar68._4_4_ <= auVar68._0_4_) {
    fVar146 = auVar68._0_4_;
  }
  fVar146 = fVar146 * 9.536743e-07;
  local_248 = fVar146;
  fStack_244 = fVar146;
  fStack_240 = fVar146;
  fStack_23c = fVar146;
  local_258 = -fVar146;
  fStack_254 = -fVar146;
  fStack_250 = -fVar146;
  fStack_24c = -fVar146;
  local_3a8._4_4_ = fVar294;
  local_3a8._0_4_ = fVar282;
  local_118 = fVar301 - fVar253;
  fStack_114 = fVar311 - fVar270;
  fStack_110 = fVar296 - fVar282;
  fStack_10c = fVar298 - fVar294;
  local_128 = fVar213 - fVar301;
  fStack_124 = fVar216 - fVar311;
  fStack_120 = fVar280 - fVar296;
  fStack_11c = fVar281 - fVar298;
  afStack_328[0] = fVar280;
  afStack_328[1] = fVar281;
  local_138 = fVar207 - fVar213;
  fStack_134 = fVar211 - fVar216;
  fStack_130 = fVar104 - fVar280;
  fStack_12c = fVar67 - fVar281;
  local_298 = fVar133 - fVar302;
  fStack_294 = fVar145 - fVar319;
  fStack_290 = fVar155 - fVar323;
  fStack_28c = fVar160 - fVar326;
  local_2a8 = fVar232 - fVar205;
  fStack_2a4 = fVar236 - fVar206;
  fStack_2a0 = fVar254 - fVar208;
  fStack_29c = fVar267 - fVar212;
  local_2b8 = fVar134 - fVar268;
  fStack_2b4 = fVar147 - fVar317;
  fStack_2b0 = fVar157 - fVar243;
  fStack_2ac = fVar172 - fVar252;
  local_2c8 = local_278 - fVar174;
  fStack_2c4 = fStack_274 - fVar177;
  fStack_2c0 = fStack_270 - fVar203;
  fStack_2bc = fStack_26c - fVar204;
  local_2d8 = uVar62;
  uStack_2d4 = uVar62;
  uStack_2d0 = uVar62;
  uStack_2cc = uVar62;
  local_2e8 = uVar64;
  uStack_2e4 = uVar64;
  uStack_2e0 = uVar64;
  uStack_2dc = uVar64;
  bVar57 = false;
  uVar64 = 0;
  fVar105 = *(float *)(ray + k * 4 + 0x30);
  local_538._4_4_ = 0.0;
  fStack_52c = 1.0;
  local_538._0_4_ = 0.0;
  fStack_530 = 1.0;
  local_380 = (ulong)uVar62;
LAB_00b16330:
  do {
    fVar106 = 1.0 - (float)local_538._4_4_;
    fVar132 = 1.0 - (float)local_538._4_4_;
    fVar160 = 1.0 - fStack_52c;
    fVar172 = 1.0 - fStack_52c;
    fVar161 = fVar253 * fVar106 + fVar282 * (float)local_538._4_4_;
    fVar159 = fVar270 * fVar132 + fVar294 * (float)local_538._4_4_;
    fVar326 = fVar253 * fVar160 + fVar282 * fStack_52c;
    fVar327 = fVar270 * fVar172 + fVar294 * fStack_52c;
    fVar204 = fVar301 * fVar106 + fVar296 * (float)local_538._4_4_;
    fVar299 = fVar311 * fVar132 + fVar298 * (float)local_538._4_4_;
    fVar316 = fVar301 * fVar160 + fVar296 * fStack_52c;
    fVar176 = fVar311 * fVar172 + fVar298 * fStack_52c;
    fVar215 = fVar213 * fVar106 + fVar280 * (float)local_538._4_4_;
    fVar218 = fVar216 * fVar132 + fVar281 * (float)local_538._4_4_;
    fVar241 = fVar213 * fVar160 + fVar280 * fStack_52c;
    fVar242 = fVar216 * fVar172 + fVar281 * fStack_52c;
    fVar328 = fVar106 * fVar207 + (float)local_538._4_4_ * fVar104;
    fVar212 = fVar132 * fVar211 + (float)local_538._4_4_ * fVar67;
    fVar214 = fVar160 * fVar207 + fStack_52c * fVar104;
    fVar217 = fVar172 * fVar211 + fStack_52c * fVar67;
    fVar235 = (fStack_530 - (float)local_538._0_4_) * 0.11111111;
    fVar237 = (fStack_530 - (float)local_538._0_4_) * 0.0 + (float)local_538._0_4_;
    fVar238 = (fStack_530 - (float)local_538._0_4_) * 0.33333334 + (float)local_538._0_4_;
    fVar239 = (fStack_530 - (float)local_538._0_4_) * 0.6666667 + (float)local_538._0_4_;
    fVar240 = (fStack_530 - (float)local_538._0_4_) * 1.0 + (float)local_538._0_4_;
    fVar160 = 1.0 - fVar237;
    fVar267 = 1.0 - fVar238;
    fVar315 = 1.0 - fVar239;
    fVar322 = 1.0 - fVar240;
    fVar252 = fVar204 * fVar160 + fVar215 * fVar237;
    fVar313 = fVar204 * fVar267 + fVar215 * fVar238;
    fVar318 = fVar204 * fVar315 + fVar215 * fVar239;
    fVar324 = fVar204 * fVar322 + fVar215 * fVar240;
    fVar325 = fVar299 * fVar160 + fVar218 * fVar237;
    fVar156 = fVar299 * fVar267 + fVar218 * fVar238;
    fVar312 = fVar299 * fVar315 + fVar218 * fVar239;
    fVar173 = fVar299 * fVar322 + fVar218 * fVar240;
    fVar106 = (fVar161 * fVar160 + fVar204 * fVar237) * fVar160 + fVar237 * fVar252;
    fVar132 = (fVar161 * fVar267 + fVar204 * fVar238) * fVar267 + fVar238 * fVar313;
    fVar172 = (fVar161 * fVar315 + fVar204 * fVar239) * fVar315 + fVar239 * fVar318;
    fVar204 = (fVar161 * fVar322 + fVar204 * fVar240) * fVar322 + fVar240 * fVar324;
    fVar158 = (fVar159 * fVar160 + fVar299 * fVar237) * fVar160 + fVar237 * fVar325;
    fVar314 = (fVar159 * fVar267 + fVar299 * fVar238) * fVar267 + fVar238 * fVar156;
    fVar175 = (fVar159 * fVar315 + fVar299 * fVar239) * fVar315 + fVar239 * fVar312;
    fVar159 = (fVar159 * fVar322 + fVar299 * fVar240) * fVar322 + fVar240 * fVar173;
    fVar252 = fVar252 * fVar160 + (fVar215 * fVar160 + fVar328 * fVar237) * fVar237;
    fVar313 = fVar313 * fVar267 + (fVar215 * fVar267 + fVar328 * fVar238) * fVar238;
    fVar318 = fVar318 * fVar315 + (fVar215 * fVar315 + fVar328 * fVar239) * fVar239;
    fVar299 = fVar324 * fVar322 + (fVar215 * fVar322 + fVar328 * fVar240) * fVar240;
    fVar161 = fVar325 * fVar160 + (fVar218 * fVar160 + fVar212 * fVar237) * fVar237;
    fVar156 = fVar156 * fVar267 + (fVar218 * fVar267 + fVar212 * fVar238) * fVar238;
    fVar312 = fVar312 * fVar315 + (fVar218 * fVar315 + fVar212 * fVar239) * fVar239;
    fVar173 = fVar173 * fVar322 + (fVar218 * fVar322 + fVar212 * fVar240) * fVar240;
    local_378 = fVar160 * fVar106 + fVar237 * fVar252;
    fStack_374 = fVar267 * fVar132 + fVar238 * fVar313;
    fStack_370 = fVar315 * fVar172 + fVar239 * fVar318;
    fStack_36c = fVar322 * fVar204 + fVar240 * fVar299;
    local_238 = fVar160 * fVar158 + fVar237 * fVar161;
    fStack_234 = fVar267 * fVar314 + fVar238 * fVar156;
    fStack_230 = fVar315 * fVar175 + fVar239 * fVar312;
    fStack_22c = fVar322 * fVar159 + fVar240 * fVar173;
    fVar324 = (fVar313 - fVar132) * 3.0 * fVar235;
    fVar325 = (fVar318 - fVar172) * 3.0 * fVar235;
    fVar299 = (fVar299 - fVar204) * 3.0 * fVar235;
    fVar132 = (fVar156 - fVar314) * 3.0 * fVar235;
    fVar204 = (fVar312 - fVar175) * 3.0 * fVar235;
    fVar313 = (fVar173 - fVar159) * 3.0 * fVar235;
    local_348._4_4_ = fStack_370;
    local_348._0_4_ = fStack_374;
    local_348._8_4_ = fStack_36c;
    local_348._12_4_ = 0;
    local_1d8._4_4_ = fStack_230;
    local_1d8._0_4_ = fStack_234;
    local_358 = local_378 + (fVar252 - fVar106) * 3.0 * fVar235;
    fStack_354 = fStack_374 + fVar324;
    fStack_350 = fStack_370 + fVar325;
    fStack_34c = fStack_36c + fVar299;
    fVar106 = local_238 + (fVar161 - fVar158) * 3.0 * fVar235;
    fVar172 = fStack_234 + fVar132;
    fVar252 = fStack_230 + fVar204;
    fVar318 = fStack_22c + fVar313;
    local_368._0_4_ = fStack_374 - fVar324;
    local_368._4_4_ = fStack_370 - fVar325;
    local_368._8_4_ = fStack_36c - fVar299;
    local_368._12_4_ = 0;
    fVar132 = fStack_234 - fVar132;
    fVar204 = fStack_230 - fVar204;
    fVar313 = fStack_22c - fVar313;
    fVar324 = fVar316 * fVar160 + fVar241 * fVar237;
    fVar325 = fVar316 * fVar267 + fVar241 * fVar238;
    fVar299 = fVar316 * fVar315 + fVar241 * fVar239;
    fVar161 = fVar316 * fVar322 + fVar241 * fVar240;
    fVar156 = fVar176 * fVar160 + fVar242 * fVar237;
    fVar312 = fVar176 * fVar267 + fVar242 * fVar238;
    fVar173 = fVar176 * fVar315 + fVar242 * fVar239;
    fVar158 = fVar176 * fVar322 + fVar242 * fVar240;
    fVar314 = (fVar326 * fVar160 + fVar316 * fVar237) * fVar160 + fVar237 * fVar324;
    fVar175 = (fVar326 * fVar267 + fVar316 * fVar238) * fVar267 + fVar238 * fVar325;
    fVar159 = (fVar326 * fVar315 + fVar316 * fVar239) * fVar315 + fVar239 * fVar299;
    fVar316 = (fVar326 * fVar322 + fVar316 * fVar240) * fVar322 + fVar240 * fVar161;
    fVar218 = (fVar327 * fVar160 + fVar176 * fVar237) * fVar160 + fVar237 * fVar156;
    fVar219 = (fVar327 * fVar267 + fVar176 * fVar238) * fVar267 + fVar238 * fVar312;
    fVar233 = (fVar327 * fVar315 + fVar176 * fVar239) * fVar315 + fVar239 * fVar173;
    fVar234 = (fVar327 * fVar322 + fVar176 * fVar240) * fVar322 + fVar240 * fVar158;
    fVar176 = fVar324 * fVar160 + (fVar241 * fVar160 + fVar214 * fVar237) * fVar237;
    fVar326 = fVar325 * fVar267 + (fVar241 * fVar267 + fVar214 * fVar238) * fVar238;
    fVar327 = fVar299 * fVar315 + (fVar241 * fVar315 + fVar214 * fVar239) * fVar239;
    fVar328 = fVar161 * fVar322 + (fVar241 * fVar322 + fVar214 * fVar240) * fVar240;
    fVar212 = fVar156 * fVar160 + (fVar242 * fVar160 + fVar217 * fVar237) * fVar237;
    fVar214 = fVar312 * fVar267 + (fVar242 * fVar267 + fVar217 * fVar238) * fVar238;
    fVar215 = fVar173 * fVar315 + (fVar242 * fVar315 + fVar217 * fVar239) * fVar239;
    fVar217 = fVar158 * fVar322 + (fVar242 * fVar322 + fVar217 * fVar240) * fVar240;
    fVar156 = fVar160 * fVar314 + fVar237 * fVar176;
    fVar312 = fVar267 * fVar175 + fVar238 * fVar326;
    fVar173 = fVar315 * fVar159 + fVar239 * fVar327;
    fVar158 = fVar322 * fVar316 + fVar240 * fVar328;
    fVar324 = fVar160 * fVar218 + fVar237 * fVar212;
    fVar325 = fVar267 * fVar219 + fVar238 * fVar214;
    fVar299 = fVar315 * fVar233 + fVar239 * fVar215;
    fVar161 = fVar322 * fVar234 + fVar240 * fVar217;
    fVar160 = (fVar326 - fVar175) * 3.0 * fVar235;
    fVar267 = (fVar327 - fVar159) * 3.0 * fVar235;
    fVar315 = (fVar328 - fVar316) * 3.0 * fVar235;
    fVar322 = (fVar214 - fVar219) * 3.0 * fVar235;
    fVar175 = (fVar215 - fVar233) * 3.0 * fVar235;
    fVar159 = (fVar217 - fVar234) * 3.0 * fVar235;
    local_1e8._4_4_ = fVar173;
    local_1e8._0_4_ = fVar312;
    local_1e8._8_4_ = fVar158;
    local_1e8._12_4_ = 0;
    local_208._4_4_ = fVar299;
    local_208._0_4_ = fVar325;
    local_208._8_4_ = fVar161;
    local_208._12_4_ = 0;
    local_228 = fVar156 + (fVar176 - fVar314) * 3.0 * fVar235;
    fStack_224 = fVar312 + fVar160;
    fStack_220 = fVar173 + fVar267;
    fStack_21c = fVar158 + fVar315;
    local_1f8 = fVar324 + (fVar212 - fVar218) * 3.0 * fVar235;
    fStack_1f4 = fVar325 + fVar322;
    fStack_1f0 = fVar299 + fVar175;
    fStack_1ec = fVar161 + fVar159;
    local_1c8._0_4_ = fVar312 - fVar160;
    local_1c8._4_4_ = fVar173 - fVar267;
    local_1c8._8_4_ = fVar158 - fVar315;
    local_1c8._12_4_ = 0;
    local_218._0_4_ = fVar325 - fVar322;
    local_218._4_4_ = fVar299 - fVar175;
    local_218._8_4_ = fVar161 - fVar159;
    local_218._12_4_ = 0;
    fVar160 = (fVar312 - fStack_374) + (fVar156 - local_378);
    fVar267 = (fVar173 - fStack_370) + (fVar312 - fStack_374);
    fVar315 = (fVar158 - fStack_36c) + (fVar173 - fStack_370);
    fVar322 = (fVar158 - fStack_36c) + 0.0;
    local_1d8._8_4_ = fStack_22c;
    local_1d8._12_4_ = 0;
    fVar314 = (fVar325 - fStack_234) + (fVar324 - local_238);
    fVar175 = (fVar299 - fStack_230) + (fVar325 - fStack_234);
    fVar159 = (fVar161 - fStack_22c) + (fVar299 - fStack_230);
    fVar316 = (fVar161 - fStack_22c) + 0.0;
    auVar225._0_8_ =
         CONCAT44(fStack_234 * fVar267 - fStack_374 * fVar175,
                  local_238 * fVar160 - local_378 * fVar314);
    auVar225._8_4_ = fStack_230 * fVar315 - fStack_370 * fVar159;
    auVar225._12_4_ = fStack_22c * fVar322 - fStack_36c * fVar316;
    auVar162._0_4_ = fVar106 * fVar160 - local_358 * fVar314;
    auVar162._4_4_ = fVar172 * fVar267 - fStack_354 * fVar175;
    auVar162._8_4_ = fVar252 * fVar315 - fStack_350 * fVar159;
    auVar162._12_4_ = fVar318 * fVar322 - fStack_34c * fVar316;
    auVar194._0_8_ =
         CONCAT44(fVar204 * fVar267 - fVar175 * local_368._4_4_,
                  fVar132 * fVar160 - fVar314 * local_368._0_4_);
    auVar194._8_4_ = fVar313 * fVar315 - fVar159 * local_368._8_4_;
    auVar194._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
    auVar308._0_4_ = fVar160 * fStack_234 - fVar314 * fStack_374;
    auVar308._4_4_ = fVar267 * fStack_230 - fVar175 * fStack_370;
    auVar308._8_4_ = fVar315 * fStack_22c - fVar159 * fStack_36c;
    auVar308._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
    auVar260._0_8_ =
         CONCAT44(fVar325 * fVar267 - fVar312 * fVar175,fVar324 * fVar160 - fVar156 * fVar314);
    auVar260._8_4_ = fVar299 * fVar315 - fVar173 * fVar159;
    auVar260._12_4_ = fVar161 * fVar322 - fVar158 * fVar316;
    auVar320._0_4_ = local_1f8 * fVar160 - local_228 * fVar314;
    auVar320._4_4_ = fStack_1f4 * fVar267 - fStack_224 * fVar175;
    auVar320._8_4_ = fStack_1f0 * fVar315 - fStack_220 * fVar159;
    auVar320._12_4_ = fStack_1ec * fVar322 - fStack_21c * fVar316;
    auVar245._0_8_ =
         CONCAT44(local_218._4_4_ * fVar267 - fVar175 * local_1c8._4_4_,
                  local_218._0_4_ * fVar160 - fVar314 * local_1c8._0_4_);
    auVar245._8_4_ = local_218._8_4_ * fVar315 - fVar159 * local_1c8._8_4_;
    auVar245._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
    auVar89._0_4_ = fVar160 * fVar325 - fVar314 * fVar312;
    auVar89._4_4_ = fVar267 * fVar299 - fVar175 * fVar173;
    auVar89._8_4_ = fVar315 * fVar161 - fVar159 * fVar158;
    auVar89._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
    auVar122._8_4_ = auVar225._8_4_;
    auVar122._0_8_ = auVar225._0_8_;
    auVar122._12_4_ = auVar225._12_4_;
    auVar68 = minps(auVar122,auVar162);
    auVar259 = maxps(auVar225,auVar162);
    auVar163._8_4_ = auVar194._8_4_;
    auVar163._0_8_ = auVar194._0_8_;
    auVar163._12_4_ = auVar194._12_4_;
    auVar136 = minps(auVar163,auVar308);
    auVar68 = minps(auVar68,auVar136);
    auVar136 = maxps(auVar194,auVar308);
    auVar138 = maxps(auVar259,auVar136);
    auVar164._8_4_ = auVar260._8_4_;
    auVar164._0_8_ = auVar260._0_8_;
    auVar164._12_4_ = auVar260._12_4_;
    auVar136 = minps(auVar164,auVar320);
    auVar261 = maxps(auVar260,auVar320);
    auVar195._8_4_ = auVar245._8_4_;
    auVar195._0_8_ = auVar245._0_8_;
    auVar195._12_4_ = auVar245._12_4_;
    auVar259 = minps(auVar195,auVar89);
    auVar136 = minps(auVar136,auVar259);
    auVar68 = minps(auVar68,auVar136);
    auVar136 = maxps(auVar245,auVar89);
    auVar136 = maxps(auVar261,auVar136);
    auVar136 = maxps(auVar138,auVar136);
    auVar226._0_4_ =
         -(uint)(local_258 <= auVar136._0_4_ && auVar68._0_4_ <= local_248) & local_268._0_4_;
    auVar226._4_4_ =
         -(uint)(fStack_254 <= auVar136._4_4_ && auVar68._4_4_ <= fStack_244) & local_268._4_4_;
    auVar226._8_4_ =
         -(uint)(fStack_250 <= auVar136._8_4_ && auVar68._8_4_ <= fStack_240) & local_268._8_4_;
    auVar226._12_4_ =
         -(uint)(fStack_24c <= auVar136._12_4_ && auVar68._12_4_ <= fStack_23c) & local_268._12_4_;
    iVar50 = movmskps((int)uVar53,auVar226);
    if (iVar50 != 0) {
      fVar160 = (fVar312 - fVar156) + (fStack_374 - local_378);
      fVar267 = (fVar173 - fVar312) + (fStack_370 - fStack_374);
      fVar315 = (fVar158 - fVar173) + (fStack_36c - fStack_370);
      fVar322 = (0.0 - fVar158) + (0.0 - fStack_36c);
      fVar314 = (fVar325 - fVar324) + (fStack_234 - local_238);
      fVar175 = (fVar299 - fVar325) + (fStack_230 - fStack_234);
      fVar159 = (fVar161 - fVar299) + (fStack_22c - fStack_230);
      fVar316 = (0.0 - fVar161) + (0.0 - fStack_22c);
      auVar329._0_8_ =
           CONCAT44(fStack_234 * fVar267 - fStack_374 * fVar175,
                    local_238 * fVar160 - local_378 * fVar314);
      auVar329._8_4_ = fStack_230 * fVar315 - fStack_370 * fVar159;
      auVar329._12_4_ = fStack_22c * fVar322 - fStack_36c * fVar316;
      auVar165._0_4_ = fVar106 * fVar160 - local_358 * fVar314;
      auVar165._4_4_ = fVar172 * fVar267 - fStack_354 * fVar175;
      auVar165._8_4_ = fVar252 * fVar315 - fStack_350 * fVar159;
      auVar165._12_4_ = fVar318 * fVar322 - fStack_34c * fVar316;
      auVar246._0_8_ =
           CONCAT44(fVar204 * fVar267 - local_368._4_4_ * fVar175,
                    fVar132 * fVar160 - local_368._0_4_ * fVar314);
      auVar246._8_4_ = fVar313 * fVar315 - local_368._8_4_ * fVar159;
      auVar246._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
      auVar196._0_4_ = fStack_234 * fVar160 - fStack_374 * fVar314;
      auVar196._4_4_ = fStack_230 * fVar267 - fStack_370 * fVar175;
      auVar196._8_4_ = fStack_22c * fVar315 - fStack_36c * fVar159;
      auVar196._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
      auVar143._0_8_ =
           CONCAT44(fVar325 * fVar267 - fVar312 * fVar175,fVar324 * fVar160 - fVar156 * fVar314);
      auVar143._8_4_ = fVar299 * fVar315 - fVar173 * fVar159;
      auVar143._12_4_ = fVar161 * fVar322 - fVar158 * fVar316;
      auVar275._0_4_ = local_1f8 * fVar160 - local_228 * fVar314;
      auVar275._4_4_ = fStack_1f4 * fVar267 - fStack_224 * fVar175;
      auVar275._8_4_ = fStack_1f0 * fVar315 - fStack_220 * fVar159;
      auVar275._12_4_ = fStack_1ec * fVar322 - fStack_21c * fVar316;
      auVar309._0_8_ =
           CONCAT44(local_218._4_4_ * fVar267 - local_1c8._4_4_ * fVar175,
                    local_218._0_4_ * fVar160 - local_1c8._0_4_ * fVar314);
      auVar309._8_4_ = local_218._8_4_ * fVar315 - local_1c8._8_4_ * fVar159;
      auVar309._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
      auVar90._0_4_ = fVar160 * fVar325 - fVar314 * fVar312;
      auVar90._4_4_ = fVar267 * fVar299 - fVar175 * fVar173;
      auVar90._8_4_ = fVar315 * fVar161 - fVar159 * fVar158;
      auVar90._12_4_ = fVar322 * 0.0 - fVar316 * 0.0;
      auVar123._8_4_ = auVar329._8_4_;
      auVar123._0_8_ = auVar329._0_8_;
      auVar123._12_4_ = auVar329._12_4_;
      auVar68 = minps(auVar123,auVar165);
      auVar259 = maxps(auVar329,auVar165);
      auVar166._8_4_ = auVar246._8_4_;
      auVar166._0_8_ = auVar246._0_8_;
      auVar166._12_4_ = auVar246._12_4_;
      auVar136 = minps(auVar166,auVar196);
      auVar68 = minps(auVar68,auVar136);
      auVar136 = maxps(auVar246,auVar196);
      auVar261 = maxps(auVar259,auVar136);
      auVar167._8_4_ = auVar143._8_4_;
      auVar167._0_8_ = auVar143._0_8_;
      auVar167._12_4_ = auVar143._12_4_;
      auVar259 = minps(auVar167,auVar275);
      auVar136 = maxps(auVar143,auVar275);
      auVar197._8_4_ = auVar309._8_4_;
      auVar197._0_8_ = auVar309._0_8_;
      auVar197._12_4_ = auVar309._12_4_;
      auVar138 = minps(auVar197,auVar90);
      auVar259 = minps(auVar259,auVar138);
      auVar68 = minps(auVar68,auVar259);
      auVar259 = maxps(auVar309,auVar90);
      auVar136 = maxps(auVar136,auVar259);
      auVar136 = maxps(auVar261,auVar136);
      auVar330._0_4_ =
           -(uint)(local_258 <= auVar136._0_4_ && auVar68._0_4_ <= local_248) & auVar226._0_4_;
      auVar330._4_4_ =
           -(uint)(fStack_254 <= auVar136._4_4_ && auVar68._4_4_ <= fStack_244) & auVar226._4_4_;
      auVar330._8_4_ =
           -(uint)(fStack_250 <= auVar136._8_4_ && auVar68._8_4_ <= fStack_240) & auVar226._8_4_;
      auVar330._12_4_ =
           -(uint)(fStack_24c <= auVar136._12_4_ && auVar68._12_4_ <= fStack_23c) & auVar226._12_4_;
      uVar62 = movmskps(iVar50,auVar330);
      if (uVar62 != 0) {
        uVar53 = (ulong)uVar64;
        afStack_328[uVar53] = (float)(uVar62 & 0xff);
        *(ulong *)(afStack_108 + uVar53 * 2) = CONCAT44(fStack_530,local_538._0_4_);
        *(ulong *)(afStack_58 + uVar53 * 2) = CONCAT44(fStack_52c,local_538._4_4_);
        uVar64 = uVar64 + 1;
      }
    }
LAB_00b169b6:
    if (uVar64 == 0) {
      if (bVar57 != false) {
        return bVar57;
      }
      fVar146 = *(float *)(ray + k * 4 + 0x80);
      auVar131._4_4_ = -(uint)(fStack_284 <= fVar146);
      auVar131._0_4_ = -(uint)(local_288 <= fVar146);
      auVar131._8_4_ = -(uint)(fStack_280 <= fVar146);
      auVar131._12_4_ = -(uint)(fStack_27c <= fVar146);
      uVar62 = movmskps((int)k,auVar131);
      uVar61 = uVar61 & uVar61 + 0xf & uVar62;
      if (uVar61 == 0) {
        return false;
      }
      goto LAB_00b154bb;
    }
    uVar62 = uVar64 - 1;
    uVar53 = (ulong)uVar62;
    fVar106 = afStack_328[uVar53];
    local_538._4_4_ = afStack_58[uVar53 * 2];
    fStack_52c = afStack_58[uVar53 * 2 + 1];
    uVar52 = 0;
    if (fVar106 != 0.0) {
      for (; ((uint)fVar106 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
      }
    }
    fVar106 = (float)((int)fVar106 - 1U & (uint)fVar106);
    afStack_328[uVar53] = fVar106;
    if (fVar106 == 0.0) {
      uVar64 = uVar62;
    }
    fVar160 = (float)(uVar52 + 1) * 0.33333334;
    fVar106 = afStack_108[uVar53 * 2];
    fVar132 = afStack_108[uVar53 * 2 + 1];
    local_538._0_4_ =
         fVar106 * (1.0 - (float)uVar52 * 0.33333334) + fVar132 * (float)uVar52 * 0.33333334;
    fStack_530 = fVar106 * (1.0 - fVar160) + fVar132 * fVar160;
    fVar160 = fVar106 * 0.0 + fVar132 * 0.0;
    fVar132 = fVar106 * 0.0 + fVar132 * 0.0;
    fVar106 = fStack_530 - (float)local_538._0_4_;
    if (fVar106 < 0.16666667) {
      fVar315 = 1.0 - (float)local_538._4_4_;
      fVar322 = 1.0 - (float)local_538._4_4_;
      fVar299 = 1.0 - fStack_52c;
      fVar161 = 1.0 - fStack_52c;
      fVar313 = fVar253 * fVar315 + fVar282 * (float)local_538._4_4_;
      fVar318 = fVar270 * fVar322 + fVar294 * (float)local_538._4_4_;
      fVar324 = fVar253 * fVar299 + fVar282 * fStack_52c;
      fVar325 = fVar270 * fVar161 + fVar294 * fStack_52c;
      fVar172 = fVar301 * fVar315 + fVar296 * (float)local_538._4_4_;
      fVar204 = fVar311 * fVar322 + fVar298 * (float)local_538._4_4_;
      fVar267 = fVar301 * fVar299 + fVar296 * fStack_52c;
      fVar252 = fVar311 * fVar161 + fVar298 * fStack_52c;
      fVar176 = fVar213 * fVar315 + fVar280 * (float)local_538._4_4_;
      fVar327 = fVar216 * fVar322 + fVar281 * (float)local_538._4_4_;
      fVar212 = fVar213 * fVar299 + fVar280 * fStack_52c;
      fVar215 = fVar216 * fVar161 + fVar281 * fStack_52c;
      fVar314 = (fVar315 * fVar207 + (float)local_538._4_4_ * fVar104) - fVar176;
      fVar175 = (fVar322 * fVar211 + (float)local_538._4_4_ * fVar67) - fVar327;
      fVar159 = (fVar299 * fVar207 + fStack_52c * fVar104) - fVar212;
      fVar316 = (fVar161 * fVar211 + fStack_52c * fVar67) - fVar215;
      fVar315 = (float)local_538._0_4_ * (fVar176 - fVar172) + fVar172;
      fVar322 = (float)local_538._0_4_ * (fVar327 - fVar204) + fVar204;
      fVar299 = (float)local_538._0_4_ * (fVar212 - fVar267) + fVar267;
      fVar161 = (float)local_538._0_4_ * (fVar215 - fVar252) + fVar252;
      fVar326 = (fVar176 - fVar172) * fStack_530 + fVar172;
      fVar328 = (fVar327 - fVar204) * fStack_530 + fVar204;
      fVar214 = (fVar212 - fVar267) * fStack_530 + fVar267;
      fVar217 = (fVar215 - fVar252) * fStack_530 + fVar252;
      fVar156 = (float)local_538._0_4_ * (fVar172 - fVar313) + fVar313;
      fVar312 = (float)local_538._0_4_ * (fVar204 - fVar318) + fVar318;
      fVar173 = (float)local_538._0_4_ * (fVar267 - fVar324) + fVar324;
      fVar158 = (float)local_538._0_4_ * (fVar252 - fVar325) + fVar325;
      fVar156 = (fVar315 - fVar156) * (float)local_538._0_4_ + fVar156;
      fVar312 = (fVar322 - fVar312) * (float)local_538._0_4_ + fVar312;
      fVar173 = (fVar299 - fVar173) * (float)local_538._0_4_ + fVar173;
      fVar158 = (fVar161 - fVar158) * (float)local_538._0_4_ + fVar158;
      fVar315 = ((((float)local_538._0_4_ * fVar314 + fVar176) - fVar315) * (float)local_538._0_4_ +
                fVar315) - fVar156;
      fVar322 = ((((float)local_538._0_4_ * fVar175 + fVar327) - fVar322) * (float)local_538._0_4_ +
                fVar322) - fVar312;
      fVar299 = ((((float)local_538._0_4_ * fVar159 + fVar212) - fVar299) * (float)local_538._0_4_ +
                fVar299) - fVar173;
      fVar161 = ((((float)local_538._0_4_ * fVar316 + fVar215) - fVar161) * (float)local_538._0_4_ +
                fVar161) - fVar158;
      fVar156 = (float)local_538._0_4_ * fVar315 + fVar156;
      fVar312 = (float)local_538._0_4_ * fVar322 + fVar312;
      fVar173 = (float)local_538._0_4_ * fVar299 + fVar173;
      fVar158 = (float)local_538._0_4_ * fVar161 + fVar158;
      fVar313 = (fVar172 - fVar313) * fStack_530 + fVar313;
      fVar318 = (fVar204 - fVar318) * fStack_530 + fVar318;
      fVar324 = (fVar267 - fVar324) * fStack_530 + fVar324;
      fVar325 = (fVar252 - fVar325) * fStack_530 + fVar325;
      fVar313 = (fVar326 - fVar313) * fStack_530 + fVar313;
      fVar318 = (fVar328 - fVar318) * fStack_530 + fVar318;
      fVar324 = (fVar214 - fVar324) * fStack_530 + fVar324;
      fVar325 = (fVar217 - fVar325) * fStack_530 + fVar325;
      fVar204 = (((fVar314 * fStack_530 + fVar176) - fVar326) * fStack_530 + fVar326) - fVar313;
      fVar267 = (((fVar175 * fStack_530 + fVar327) - fVar328) * fStack_530 + fVar328) - fVar318;
      fVar252 = (((fVar159 * fStack_530 + fVar212) - fVar214) * fStack_530 + fVar214) - fVar324;
      fVar328 = (((fVar316 * fStack_530 + fVar215) - fVar217) * fStack_530 + fVar217) - fVar325;
      fVar313 = fStack_530 * fVar204 + fVar313;
      fVar318 = fStack_530 * fVar267 + fVar318;
      fVar324 = fStack_530 * fVar252 + fVar324;
      fVar325 = fStack_530 * fVar328 + fVar325;
      fVar172 = fVar106 * 0.33333334;
      fVar314 = fVar315 * 3.0 * fVar172 + fVar156;
      fVar175 = fVar322 * 3.0 * fVar172 + fVar312;
      fVar159 = fVar299 * 3.0 * fVar172 + fVar173;
      fVar316 = fVar161 * 3.0 * fVar172 + fVar158;
      fVar176 = fVar313 - fVar172 * fVar204 * 3.0;
      fVar326 = fVar318 - fVar172 * fVar267 * 3.0;
      fVar327 = fVar324 - fVar172 * fVar252 * 3.0;
      fVar328 = fVar325 - fVar172 * fVar328 * 3.0;
      fVar315 = (fVar324 - fVar313) + (fVar173 - fVar156);
      fVar322 = (fVar325 - fVar318) + (fVar158 - fVar312);
      auVar262._0_4_ = fVar326 * fVar322;
      auVar262._4_4_ = fVar326 * fVar322;
      auVar262._8_4_ = fVar328 * fVar322;
      auVar262._12_4_ = fVar328 * fVar322;
      fVar172 = fVar156 * fVar315 + fVar312 * fVar322;
      fVar204 = fVar173 * fVar315 + fVar158 * fVar322;
      fVar299 = fVar314 * fVar315 + fVar175 * fVar322;
      fVar161 = fVar159 * fVar315 + fVar316 * fVar322;
      fVar212 = fVar176 * fVar315 + auVar262._0_4_;
      auVar227._0_8_ = CONCAT44(fVar326 * fVar315 + auVar262._4_4_,fVar212);
      auVar227._8_4_ = fVar327 * fVar315 + auVar262._8_4_;
      auVar227._12_4_ = fVar328 * fVar315 + auVar262._12_4_;
      fVar252 = fVar315 * fVar313 + fVar322 * fVar318;
      fVar214 = fVar315 * fVar324 + fVar322 * fVar325;
      auVar22._4_8_ = auVar262._8_8_;
      auVar22._0_4_ = fVar175 * fVar315 + fVar175 * fVar322;
      auVar263._0_8_ = auVar22._0_8_ << 0x20;
      auVar263._8_4_ = fVar161;
      auVar263._12_4_ = fVar316 * fVar315 + fVar316 * fVar322;
      fVar267 = fVar299;
      if (fVar299 <= fVar172) {
        fVar267 = fVar172;
        fVar172 = fVar299;
      }
      auVar264._8_8_ = auVar263._8_8_;
      auVar264._0_8_ = auVar264._8_8_;
      auVar91._8_4_ = auVar227._8_4_;
      auVar91._0_8_ = auVar227._0_8_;
      auVar91._12_4_ = auVar227._12_4_;
      if (fVar252 <= fVar212) {
        auVar91._0_4_ = fVar252;
      }
      if (auVar91._0_4_ <= fVar172) {
        fVar172 = auVar91._0_4_;
      }
      auVar23._4_8_ = auVar91._8_8_;
      auVar23._0_4_ = fVar315 * fVar318 + fVar322 * fVar318;
      auVar92._0_8_ = auVar23._0_8_ << 0x20;
      auVar92._8_4_ = fVar214;
      auVar92._12_4_ = fVar315 * fVar325 + fVar322 * fVar325;
      if (fVar252 <= fVar212) {
        fVar252 = fVar212;
      }
      auVar93._8_8_ = auVar92._8_8_;
      auVar93._0_8_ = auVar93._8_8_;
      if (fVar252 <= fVar267) {
        fVar252 = fVar267;
      }
      if (fVar161 <= fVar204) {
        auVar264._0_4_ = fVar204;
        fVar204 = fVar161;
      }
      auVar124._8_4_ = auVar227._8_4_;
      auVar124._0_8_ = auVar227._8_8_;
      auVar124._12_4_ = auVar227._12_4_;
      if (fVar214 <= auVar227._8_4_) {
        auVar124._0_4_ = fVar214;
      }
      if (auVar124._0_4_ <= fVar204) {
        fVar204 = auVar124._0_4_;
      }
      if (fVar214 <= auVar227._8_4_) {
        auVar93._0_4_ = auVar227._8_4_;
      }
      if (auVar93._0_4_ <= auVar264._0_4_) {
        auVar93._0_4_ = auVar264._0_4_;
      }
      fVar267 = auVar93._0_4_;
      if ((0.0001 <= fVar172) || (fVar267 <= -0.0001)) break;
      goto LAB_00b16d19;
    }
  } while( true );
  if ((fVar204 < 0.0001 && -0.0001 < fVar252) ||
     ((fVar172 < 0.0001 && -0.0001 < fVar252 || (fVar204 < 0.0001 && -0.0001 < fVar267)))) {
LAB_00b16d19:
    fVar322 = (float)(~-(uint)(fVar172 < 0.0) & 0x3f800000 | -(uint)(fVar172 < 0.0) & 0xbf800000);
    fVar299 = (float)(~-(uint)(fVar252 < 0.0) & 0x3f800000 | -(uint)(fVar252 < 0.0) & 0xbf800000);
    fVar315 = 0.0;
    if ((fVar322 == fVar299) && (!NAN(fVar322) && !NAN(fVar299))) {
      fVar315 = INFINITY;
    }
    fVar161 = 0.0;
    if ((fVar322 == fVar299) && (!NAN(fVar322) && !NAN(fVar299))) {
      fVar161 = -INFINITY;
    }
    fVar212 = (float)(~-(uint)(fVar204 < 0.0) & 0x3f800000 | -(uint)(fVar204 < 0.0) & 0xbf800000);
    if ((fVar322 != fVar212) || (fVar214 = fVar161, NAN(fVar322) || NAN(fVar212))) {
      if ((fVar204 != fVar172) || (NAN(fVar204) || NAN(fVar172))) {
        fVar204 = -fVar172 / (fVar204 - fVar172);
        fVar204 = (1.0 - fVar204) * 0.0 + fVar204;
        fVar214 = fVar204;
      }
      else {
        fVar204 = 0.0;
        if ((fVar172 != 0.0) || (fVar214 = 1.0, NAN(fVar172))) {
          fVar204 = INFINITY;
          fVar214 = -INFINITY;
        }
      }
      if (fVar204 <= fVar315) {
        fVar315 = fVar204;
      }
      if (fVar214 <= fVar161) {
        fVar214 = fVar161;
      }
    }
    fVar172 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar267 < 0.0) * 4);
    if ((fVar299 != fVar172) || (fVar204 = fVar214, NAN(fVar299) || NAN(fVar172))) {
      if ((fVar267 != fVar252) || (NAN(fVar267) || NAN(fVar252))) {
        fVar322 = -fVar252 / (fVar267 - fVar252);
        fVar322 = (1.0 - fVar322) * 0.0 + fVar322;
        fVar204 = fVar322;
      }
      else {
        fVar322 = 0.0;
        if ((fVar252 != 0.0) || (fVar204 = 1.0, NAN(fVar252))) {
          fVar322 = INFINITY;
          fVar204 = -INFINITY;
        }
      }
      if (fVar322 <= fVar315) {
        fVar315 = fVar322;
      }
      if (fVar204 <= fVar214) {
        fVar204 = fVar214;
      }
    }
    if ((fVar212 != fVar172) || (NAN(fVar212) || NAN(fVar172))) {
      fVar315 = (float)(~-(uint)(fVar315 < 1.0) & 0x3f800000 |
                       (uint)fVar315 & -(uint)(fVar315 < 1.0));
      fVar204 = (float)(~-(uint)(fVar204 < 1.0) & (uint)fVar204 |
                       -(uint)(fVar204 < 1.0) & 0x3f800000);
    }
    fVar315 = (float)(~-(uint)(fVar315 < 0.0) & (uint)fVar315);
    fVar172 = (float)(~-(uint)(fVar204 < 1.0) & 0x3f800000 | (uint)fVar204 & -(uint)(fVar204 < 1.0))
    ;
    if (fVar315 <= fVar172) {
      fVar315 = fVar315 + -0.1;
      fVar172 = fVar172 + 0.1;
      uVar65 = -(uint)(fVar172 < 1.0);
      fVar315 = (float)(~-(uint)(fVar315 < 0.0) & (uint)fVar315);
      fVar172 = (float)(~uVar65 & 0x3f800000 | (uint)fVar172 & uVar65);
      fVar212 = 1.0 - fVar315;
      fVar214 = 1.0 - fVar315;
      fVar215 = 1.0 - fVar172;
      fVar217 = 1.0 - fVar172;
      fVar204 = fVar156 * fVar212 + fVar173 * fVar315;
      fVar252 = fVar312 * fVar214 + fVar158 * fVar315;
      fVar322 = fVar156 * fVar215 + fVar173 * fVar172;
      fVar299 = fVar312 * fVar217 + fVar158 * fVar172;
      fVar161 = fVar314 * fVar212 + fVar159 * fVar315;
      fVar156 = fVar175 * fVar214 + fVar316 * fVar315;
      fVar173 = fVar314 * fVar215 + fVar159 * fVar172;
      fVar158 = fVar175 * fVar217 + fVar316 * fVar172;
      fVar314 = fVar176 * fVar212 + fVar327 * fVar315;
      fVar175 = fVar326 * fVar214 + fVar328 * fVar315;
      fVar159 = fVar176 * fVar215 + fVar327 * fVar172;
      fVar316 = fVar326 * fVar217 + fVar328 * fVar172;
      fVar176 = fVar212 * fVar313 + fVar324 * fVar315;
      fVar326 = fVar214 * fVar318 + fVar325 * fVar315;
      fVar313 = fVar215 * fVar313 + fVar324 * fVar172;
      fVar318 = fVar217 * fVar318 + fVar325 * fVar172;
      fVar324 = (float)local_538._4_4_ * (1.0 - fVar172);
      local_538._4_4_ = (float)local_538._4_4_ * (1.0 - fVar315) + fStack_52c * fVar315;
      fStack_52c = fVar324 + fStack_52c * fVar172;
      fVar312 = 1.0 / fVar106;
      auVar125._0_4_ = fVar313 - fVar176;
      auVar125._4_4_ = fVar318 - fVar326;
      auVar125._8_4_ = fVar313 - fVar313;
      auVar125._12_4_ = fVar318 - fVar318;
      auVar153._0_8_ = CONCAT44(fVar316 - fVar175,fVar159 - fVar314);
      auVar153._8_4_ = fVar159 - fVar159;
      auVar153._12_4_ = fVar316 - fVar316;
      auVar198._0_4_ = fVar173 - fVar161;
      auVar198._4_4_ = fVar158 - fVar156;
      auVar198._8_4_ = fVar173 - fVar173;
      auVar198._12_4_ = fVar158 - fVar158;
      auVar265._0_8_ = CONCAT44((fVar156 - fVar252) * 3.0,(fVar161 - fVar204) * 3.0);
      auVar265._8_4_ = (fVar173 - fVar322) * 3.0;
      auVar265._12_4_ = (fVar158 - fVar299) * 3.0;
      auVar168._0_8_ = CONCAT44((fVar175 - fVar156) * 3.0,(fVar314 - fVar161) * 3.0);
      auVar168._8_4_ = (fVar159 - fVar173) * 3.0;
      auVar168._12_4_ = (fVar316 - fVar158) * 3.0;
      auVar290._0_4_ = (fVar176 - fVar314) * 3.0;
      auVar290._4_4_ = (fVar326 - fVar175) * 3.0;
      auVar290._8_4_ = (fVar313 - fVar159) * 3.0;
      auVar290._12_4_ = (fVar318 - fVar316) * 3.0;
      auVar228._8_4_ = auVar168._8_4_;
      auVar228._0_8_ = auVar168._0_8_;
      auVar228._12_4_ = auVar168._12_4_;
      auVar136 = minps(auVar228,auVar290);
      auVar68 = maxps(auVar168,auVar290);
      auVar276._8_4_ = auVar265._8_4_;
      auVar276._0_8_ = auVar265._0_8_;
      auVar276._12_4_ = auVar265._12_4_;
      auVar138 = minps(auVar276,auVar136);
      auVar259 = maxps(auVar265,auVar68);
      auVar24._4_8_ = auVar68._8_8_;
      auVar24._0_4_ = auVar138._4_4_;
      auVar169._0_8_ = auVar24._0_8_ << 0x20;
      auVar169._8_4_ = auVar138._8_4_;
      auVar169._12_4_ = auVar138._12_4_;
      auVar170._8_8_ = auVar138._8_8_;
      auVar170._0_8_ = auVar169._8_8_;
      auVar25._4_8_ = auVar136._8_8_;
      auVar25._0_4_ = auVar259._4_4_;
      auVar229._0_8_ = auVar25._0_8_ << 0x20;
      auVar229._8_4_ = auVar259._8_4_;
      auVar229._12_4_ = auVar259._12_4_;
      auVar230._8_8_ = auVar259._8_8_;
      auVar230._0_8_ = auVar229._8_8_;
      auVar136 = minps(auVar138,auVar170);
      auVar68 = maxps(auVar259,auVar230);
      fVar214 = auVar136._0_4_ * fVar312;
      fVar215 = auVar136._4_4_ * fVar312;
      fVar217 = auVar136._8_4_ * fVar312;
      fVar218 = auVar136._12_4_ * fVar312;
      fVar173 = fVar312 * auVar68._0_4_;
      fVar314 = fVar312 * auVar68._4_4_;
      fVar159 = fVar312 * auVar68._8_4_;
      fVar312 = fVar312 * auVar68._12_4_;
      fVar328 = 1.0 / (fStack_52c - (float)local_538._4_4_);
      auVar94._0_8_ = CONCAT44(fVar299 - fVar252,fVar322 - fVar204);
      auVar94._8_4_ = fVar322 - fVar322;
      auVar94._12_4_ = fVar299 - fVar299;
      auVar247._8_4_ = auVar94._8_4_;
      auVar247._0_8_ = auVar94._0_8_;
      auVar247._12_4_ = auVar94._12_4_;
      auVar259 = minps(auVar247,auVar198);
      auVar68 = maxps(auVar94,auVar198);
      auVar144._8_4_ = auVar153._8_4_;
      auVar144._0_8_ = auVar153._0_8_;
      auVar144._12_4_ = auVar153._12_4_;
      auVar136 = minps(auVar144,auVar125);
      auVar259 = minps(auVar259,auVar136);
      auVar136 = maxps(auVar153,auVar125);
      auVar68 = maxps(auVar68,auVar136);
      fVar326 = auVar259._0_4_ * fVar328;
      fVar327 = auVar259._4_4_ * fVar328;
      fVar212 = fVar328 * auVar68._0_4_;
      fVar328 = fVar328 * auVar68._4_4_;
      auVar231._4_4_ = fStack_52c;
      auVar231._0_4_ = fStack_530;
      auVar231._8_4_ = fVar160;
      auVar231._12_4_ = fVar132;
      fVar325 = ((float)local_538._0_4_ + fStack_530) * 0.5;
      fVar299 = ((float)local_538._4_4_ + fStack_52c) * 0.5;
      fVar161 = (fStack_530 + fVar160) * 0.0;
      fVar156 = (fStack_52c + fVar132) * 0.0;
      fVar172 = local_118 * fVar325 + fVar253;
      fVar204 = fStack_114 * fVar325 + fVar270;
      fVar252 = fStack_110 * fVar325 + fStack_3b0;
      fVar313 = fStack_10c * fVar325 + fStack_3ac;
      fVar315 = local_128 * fVar325 + fVar301;
      fVar318 = fStack_124 * fVar325 + fVar311;
      fVar322 = fStack_120 * fVar325 + fVar296;
      fVar324 = fStack_11c * fVar325 + fVar298;
      fVar172 = (fVar315 - fVar172) * fVar325 + fVar172;
      fVar204 = (fVar318 - fVar204) * fVar325 + fVar204;
      fVar252 = (fVar322 - fVar252) * fVar325 + fVar252;
      fVar313 = (fVar324 - fVar313) * fVar325 + fVar313;
      fVar315 = (((local_138 * fVar325 + (float)local_338) - fVar315) * fVar325 + fVar315) - fVar172
      ;
      fVar318 = (((fStack_134 * fVar325 + local_338._4_4_) - fVar318) * fVar325 + fVar318) - fVar204
      ;
      fVar322 = (((fStack_130 * fVar325 + fStack_330) - fVar322) * fVar325 + fVar322) - fVar252;
      fVar324 = (((fStack_12c * fVar325 + fStack_32c) - fVar324) * fVar325 + fVar324) - fVar313;
      fVar172 = fVar325 * fVar315 + fVar172;
      fVar204 = fVar325 * fVar318 + fVar204;
      fVar315 = fVar315 * 3.0;
      fVar318 = fVar318 * 3.0;
      fVar252 = (fVar325 * fVar322 + fVar252) - fVar172;
      fVar313 = (fVar325 * fVar324 + fVar313) - fVar204;
      fVar315 = (fVar322 * 3.0 - fVar315) * fVar299 + fVar315;
      fVar318 = (fVar324 * 3.0 - fVar318) * fVar299 + fVar318;
      auVar154._0_8_ = CONCAT44(fVar315,fVar252) ^ 0x80000000;
      auVar154._8_4_ = fVar315;
      auVar154._12_4_ = fVar315;
      fVar219 = (float)local_538._0_4_ - fVar325;
      fVar233 = (float)local_538._4_4_ - fVar299;
      fVar234 = fStack_530 - fVar161;
      fVar235 = fStack_52c - fVar156;
      fVar237 = fStack_530 - fVar325;
      fVar238 = fStack_52c - fVar299;
      fVar160 = fVar160 - fVar161;
      fVar132 = fVar132 - fVar156;
      fVar172 = fVar252 * fVar299 + fVar172;
      fVar204 = fVar313 * fVar299 + fVar204;
      auVar171._0_8_ = CONCAT44(fVar318,fVar313) ^ 0x8000000000000000;
      auVar171._8_4_ = -fVar318;
      auVar171._12_4_ = -fVar318;
      auVar95._0_4_ = fVar313 * fVar315 - fVar318 * fVar252;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar136 = divps(auVar171,auVar95);
      auVar68 = divps(auVar154,auVar95);
      fVar161 = auVar136._0_4_;
      fVar156 = auVar136._4_4_;
      fVar322 = auVar68._0_4_;
      fVar324 = auVar68._4_4_;
      fVar325 = fVar325 - (fVar204 * fVar322 + fVar172 * fVar161);
      fVar315 = fVar299 - (fVar204 * fVar324 + fVar172 * fVar156);
      fVar318 = fVar299 - (fVar204 * auVar68._8_4_ + fVar172 * auVar136._8_4_);
      fVar299 = fVar299 - (fVar204 * auVar68._12_4_ + fVar172 * auVar136._12_4_);
      auVar126._0_8_ = CONCAT44(fVar156 * fVar326,fVar156 * fVar214);
      auVar126._8_4_ = fVar156 * fVar215;
      auVar126._12_4_ = fVar156 * fVar327;
      auVar96._0_4_ = fVar156 * fVar173;
      auVar96._4_4_ = fVar156 * fVar212;
      auVar96._8_4_ = fVar156 * fVar314;
      auVar96._12_4_ = fVar156 * fVar328;
      auVar332._8_4_ = auVar126._8_4_;
      auVar332._0_8_ = auVar126._0_8_;
      auVar332._12_4_ = auVar126._12_4_;
      auVar138 = minps(auVar332,auVar96);
      auVar68 = maxps(auVar96,auVar126);
      auVar199._0_8_ = CONCAT44(fVar324 * fVar327,fVar324 * fVar215);
      auVar199._8_4_ = fVar324 * fVar217;
      auVar199._12_4_ = fVar324 * fVar218;
      auVar127._0_4_ = fVar324 * fVar314;
      auVar127._4_4_ = fVar324 * fVar328;
      auVar127._8_4_ = fVar324 * fVar159;
      auVar127._12_4_ = fVar324 * fVar312;
      auVar277._8_4_ = auVar199._8_4_;
      auVar277._0_8_ = auVar199._0_8_;
      auVar277._12_4_ = auVar199._12_4_;
      auVar259 = minps(auVar277,auVar127);
      auVar136 = maxps(auVar127,auVar199);
      fVar172 = 0.0 - (auVar136._0_4_ + auVar68._0_4_);
      fVar204 = 1.0 - (auVar136._4_4_ + auVar68._4_4_);
      fVar252 = 0.0 - (auVar136._8_4_ + auVar68._8_4_);
      fVar313 = 0.0 - (auVar136._12_4_ + auVar68._12_4_);
      fVar158 = 0.0 - (auVar259._0_4_ + auVar138._0_4_);
      fVar175 = 1.0 - (auVar259._4_4_ + auVar138._4_4_);
      fVar316 = 0.0 - (auVar259._8_4_ + auVar138._8_4_);
      fVar176 = 0.0 - (auVar259._12_4_ + auVar138._12_4_);
      auVar128._0_8_ = CONCAT44(fVar233 * fVar204,fVar219 * fVar172);
      auVar128._8_4_ = fVar234 * fVar252;
      auVar128._12_4_ = fVar235 * fVar313;
      auVar291._0_8_ = CONCAT44(fVar326 * fVar161,fVar214 * fVar161);
      auVar291._8_4_ = fVar215 * fVar161;
      auVar291._12_4_ = fVar327 * fVar161;
      auVar200._0_4_ = fVar161 * fVar173;
      auVar200._4_4_ = fVar161 * fVar212;
      auVar200._8_4_ = fVar161 * fVar314;
      auVar200._12_4_ = fVar161 * fVar328;
      auVar278._8_4_ = auVar291._8_4_;
      auVar278._0_8_ = auVar291._0_8_;
      auVar278._12_4_ = auVar291._12_4_;
      auVar136 = minps(auVar278,auVar200);
      auVar68 = maxps(auVar200,auVar291);
      auVar248._0_8_ = CONCAT44(fVar327 * fVar322,fVar215 * fVar322);
      auVar248._8_4_ = fVar217 * fVar322;
      auVar248._12_4_ = fVar218 * fVar322;
      auVar292._0_4_ = fVar322 * fVar314;
      auVar292._4_4_ = fVar322 * fVar328;
      auVar292._8_4_ = fVar322 * fVar159;
      auVar292._12_4_ = fVar322 * fVar312;
      auVar331._8_4_ = auVar248._8_4_;
      auVar331._0_8_ = auVar248._0_8_;
      auVar331._12_4_ = auVar248._12_4_;
      auVar138 = minps(auVar331,auVar292);
      auVar279._0_4_ = fVar219 * fVar158;
      auVar279._4_4_ = fVar233 * fVar175;
      auVar279._8_4_ = fVar234 * fVar316;
      auVar279._12_4_ = fVar235 * fVar176;
      auVar97._0_8_ = CONCAT44(fVar204 * fVar238,fVar172 * fVar237);
      auVar97._8_4_ = fVar252 * fVar160;
      auVar97._12_4_ = fVar313 * fVar132;
      auVar210._0_4_ = fVar158 * fVar237;
      auVar210._4_4_ = fVar175 * fVar238;
      auVar210._8_4_ = fVar316 * fVar160;
      auVar210._12_4_ = fVar176 * fVar132;
      auVar259 = maxps(auVar292,auVar248);
      fVar172 = 1.0 - (auVar259._0_4_ + auVar68._0_4_);
      fVar204 = 0.0 - (auVar259._4_4_ + auVar68._4_4_);
      fVar252 = 0.0 - (auVar259._8_4_ + auVar68._8_4_);
      fVar313 = 0.0 - (auVar259._12_4_ + auVar68._12_4_);
      fVar312 = 1.0 - (auVar138._0_4_ + auVar136._0_4_);
      fVar173 = 0.0 - (auVar138._4_4_ + auVar136._4_4_);
      fVar158 = 0.0 - (auVar138._8_4_ + auVar136._8_4_);
      fVar314 = 0.0 - (auVar138._12_4_ + auVar136._12_4_);
      auVar249._0_8_ = CONCAT44(fVar233 * fVar204,fVar219 * fVar172);
      auVar249._8_4_ = fVar234 * fVar252;
      auVar249._12_4_ = fVar235 * fVar313;
      auVar310._0_4_ = fVar219 * fVar312;
      auVar310._4_4_ = fVar233 * fVar173;
      auVar310._8_4_ = fVar234 * fVar158;
      auVar310._12_4_ = fVar235 * fVar314;
      auVar201._0_8_ = CONCAT44(fVar204 * fVar238,fVar172 * fVar237);
      auVar201._8_4_ = fVar252 * fVar160;
      auVar201._12_4_ = fVar313 * fVar132;
      auVar266._0_4_ = fVar312 * fVar237;
      auVar266._4_4_ = fVar173 * fVar238;
      auVar266._8_4_ = fVar158 * fVar160;
      auVar266._12_4_ = fVar314 * fVar132;
      auVar293._8_4_ = auVar249._8_4_;
      auVar293._0_8_ = auVar249._0_8_;
      auVar293._12_4_ = auVar249._12_4_;
      auVar68 = minps(auVar293,auVar310);
      auVar321._8_4_ = auVar201._8_4_;
      auVar321._0_8_ = auVar201._0_8_;
      auVar321._12_4_ = auVar201._12_4_;
      auVar136 = minps(auVar321,auVar266);
      auVar261 = minps(auVar68,auVar136);
      auVar136 = maxps(auVar310,auVar249);
      auVar68 = maxps(auVar266,auVar201);
      auVar259 = maxps(auVar68,auVar136);
      auVar250._8_4_ = auVar128._8_4_;
      auVar250._0_8_ = auVar128._0_8_;
      auVar250._12_4_ = auVar128._12_4_;
      auVar136 = minps(auVar250,auVar279);
      auVar202._8_4_ = auVar97._8_4_;
      auVar202._0_8_ = auVar97._0_8_;
      auVar202._12_4_ = auVar97._12_4_;
      auVar68 = minps(auVar202,auVar210);
      auVar136 = minps(auVar136,auVar68);
      auVar138 = maxps(auVar279,auVar128);
      auVar68 = maxps(auVar210,auVar97);
      auVar68 = maxps(auVar68,auVar138);
      auVar251._0_4_ = auVar261._4_4_ + auVar261._0_4_ + fVar325;
      auVar251._4_4_ = auVar136._4_4_ + auVar136._0_4_ + fVar315;
      auVar251._8_4_ = auVar261._8_4_ + auVar261._4_4_ + fVar318;
      auVar251._12_4_ = auVar261._12_4_ + auVar136._4_4_ + fVar299;
      fVar132 = auVar259._4_4_ + auVar259._0_4_ + fVar325;
      fVar160 = auVar68._4_4_ + auVar68._0_4_ + fVar315;
      auVar98._4_4_ = fVar160;
      auVar98._0_4_ = fVar132;
      auVar136 = maxps(_local_538,auVar251);
      auVar98._8_4_ = auVar259._8_4_ + auVar259._4_4_ + fVar318;
      auVar98._12_4_ = auVar259._12_4_ + auVar68._4_4_ + fVar299;
      auVar68 = minps(auVar98,auVar231);
      iVar50 = -(uint)(auVar68._0_4_ < auVar136._0_4_);
      iVar63 = -(uint)(auVar68._4_4_ < auVar136._4_4_);
      auVar100._4_4_ = iVar63;
      auVar100._0_4_ = iVar50;
      auVar100._8_4_ = iVar63;
      auVar100._12_4_ = iVar63;
      auVar99._8_8_ = auVar100._8_8_;
      auVar99._4_4_ = iVar50;
      auVar99._0_4_ = iVar50;
      iVar50 = movmskpd((uint)(fVar267 < 0.0),auVar99);
      if (iVar50 == 0) {
        bVar49 = 0;
        if (((float)local_538._0_4_ < auVar251._0_4_) && (fVar132 < fStack_530)) {
          bVar49 = -(fVar160 < fStack_52c) & (float)local_538._4_4_ < auVar251._4_4_;
        }
        bVar49 = (3 < uVar64 || fVar106 < 0.001) | bVar49;
        uVar53 = (ulong)CONCAT31((int3)(uVar62 >> 8),bVar49);
        if (bVar49 != 1) goto LAB_00b16330;
        lVar54 = 200;
        do {
          fVar106 = 1.0 - fVar325;
          fVar204 = fVar325 * fVar325 * fVar325;
          fVar172 = fVar325 * fVar325 * 3.0 * fVar106;
          fVar132 = fVar106 * fVar106 * fVar106;
          fVar267 = fVar325 * 3.0 * fVar106 * fVar106;
          fVar160 = fVar132 * fVar253 +
                    fVar267 * fVar301 + fVar172 * (float)local_338 + fVar204 * fVar207;
          fVar106 = fVar132 * fVar270 +
                    fVar267 * fVar311 + fVar172 * local_338._4_4_ + fVar204 * fVar211;
          fVar160 = ((fVar132 * fStack_3b0 +
                     fVar267 * fVar296 + fVar172 * fStack_330 + fVar204 * fVar104) - fVar160) *
                    fVar315 + fVar160;
          fVar106 = ((fVar132 * fStack_3ac +
                     fVar267 * fVar298 + fVar172 * fStack_32c + fVar204 * fVar67) - fVar106) *
                    fVar315 + fVar106;
          fVar325 = fVar325 - (fVar106 * fVar322 + fVar160 * fVar161);
          fVar315 = fVar315 - (fVar106 * fVar324 + fVar160 * fVar156);
          fVar160 = (float)((uint)fVar160 & (uint)DAT_01f7b6c0);
          fVar106 = (float)((uint)fVar106 & DAT_01f7b6c0._4_4_);
          if (fVar106 <= fVar160) {
            fVar106 = fVar160;
          }
          if (fVar106 < fVar146) {
            if ((((0.0 <= fVar325) && (fVar325 <= 1.0)) && (0.0 <= fVar315)) && (fVar315 <= 1.0)) {
              fVar106 = pre->ray_space[k].vx.field_0.m128[2];
              fVar132 = pre->ray_space[k].vy.field_0.m128[2];
              fVar160 = pre->ray_space[k].vz.field_0.m128[2];
              fVar318 = 1.0 - fVar315;
              fVar313 = 1.0 - fVar325;
              fVar172 = fVar313 * fVar313 * fVar313;
              fVar204 = fVar325 * 3.0 * fVar313 * fVar313;
              fVar252 = fVar325 * fVar325 * fVar325;
              fVar267 = fVar325 * fVar325 * 3.0 * fVar313;
              fVar106 = ((fStack_140 * fVar160 + fStack_144 * fVar132 + local_148 * fVar106) *
                         fVar318 +
                        (fStack_180 * fVar160 + fStack_184 * fVar132 + local_188 * fVar106) *
                        fVar315) * fVar172 +
                        ((fStack_150 * fVar160 + fStack_154 * fVar132 + local_158 * fVar106) *
                         fVar318 +
                        (fStack_190 * fVar160 + fStack_194 * fVar132 + local_198 * fVar106) *
                        fVar315) * fVar204 +
                        ((fStack_160 * fVar160 + fStack_164 * fVar132 + local_168 * fVar106) *
                         fVar318 +
                        (fStack_1a0 * fVar160 + fStack_1a4 * fVar132 + local_1a8 * fVar106) *
                        fVar315) * fVar267 +
                        (fVar318 * (fStack_170 * fVar160 +
                                   fStack_174 * fVar132 + local_178 * fVar106) +
                        (fVar160 * fStack_1b0 + fVar132 * fStack_1b4 + fVar106 * local_1b8) *
                        fVar315) * fVar252;
              if ((fVar105 <= fVar106) &&
                 (fVar132 = *(float *)(ray + k * 4 + 0x80), fVar106 <= fVar132)) {
                fVar324 = 1.0 - fVar315;
                fVar299 = 1.0 - fVar315;
                fVar161 = 1.0 - fVar315;
                fVar160 = fVar205 * fVar324 + fVar232 * fVar315;
                fVar318 = fVar206 * fVar299 + fVar236 * fVar315;
                fVar322 = fVar208 * fVar161 + fVar254 * fVar315;
                fVar156 = fVar268 * fVar324 + fVar134 * fVar315;
                fVar173 = fVar317 * fVar299 + fVar147 * fVar315;
                fVar314 = fVar243 * fVar161 + fVar157 * fVar315;
                fVar312 = fVar156 - fVar160;
                fVar158 = fVar173 - fVar318;
                fVar175 = fVar314 - fVar322;
                fVar160 = (((fVar160 - (fVar302 * fVar324 + fVar133 * fVar315)) * fVar313 +
                           fVar325 * fVar312) * fVar313 +
                          (fVar312 * fVar313 +
                          ((fVar324 * fVar174 + local_278 * fVar315) - fVar156) * fVar325) * fVar325
                          ) * 3.0;
                fVar318 = (((fVar318 - (fVar319 * fVar299 + fVar145 * fVar315)) * fVar313 +
                           fVar325 * fVar158) * fVar313 +
                          (fVar158 * fVar313 +
                          ((fVar299 * fVar177 + fStack_274 * fVar315) - fVar173) * fVar325) *
                          fVar325) * 3.0;
                fVar313 = (((fVar322 - (fVar323 * fVar161 + fVar155 * fVar315)) * fVar313 +
                           fVar325 * fVar175) * fVar313 +
                          (fVar175 * fVar313 +
                          ((fVar161 * fVar203 + fStack_270 * fVar315) - fVar314) * fVar325) *
                          fVar325) * 3.0;
                pGVar15 = (context->scene->geometries).items[local_380].ptr;
                if ((pGVar15->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar60 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar60 = true, pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar322 = fVar172 * local_298 +
                            fVar204 * local_2a8 + fVar267 * local_2b8 + fVar252 * local_2c8;
                  fVar324 = fVar172 * fStack_294 +
                            fVar204 * fStack_2a4 + fVar267 * fStack_2b4 + fVar252 * fStack_2c4;
                  fVar172 = fVar172 * fStack_290 +
                            fVar204 * fStack_2a0 + fVar267 * fStack_2b0 + fVar252 * fStack_2c0;
                  local_c8 = fVar324 * fVar160 - fVar318 * fVar322;
                  local_e8 = fVar172 * fVar318 - fVar313 * fVar324;
                  local_d8 = fVar322 * fVar313 - fVar160 * fVar172;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  fStack_c4 = local_c8;
                  fStack_c0 = local_c8;
                  fStack_bc = local_c8;
                  local_b8 = fVar325;
                  fStack_b4 = fVar325;
                  fStack_b0 = fVar325;
                  fStack_ac = fVar325;
                  local_a8 = fVar315;
                  fStack_a4 = fVar315;
                  fStack_a0 = fVar315;
                  fStack_9c = fVar315;
                  local_98 = CONCAT44(uStack_2e4,local_2e8);
                  uStack_90 = CONCAT44(uStack_2dc,uStack_2e0);
                  local_88 = CONCAT44(uStack_2d4,local_2d8);
                  uStack_80 = CONCAT44(uStack_2cc,uStack_2d0);
                  local_78 = context->user->instID[0];
                  uStack_74 = local_78;
                  uStack_70 = local_78;
                  uStack_6c = local_78;
                  local_68 = context->user->instPrimID[0];
                  uStack_64 = local_68;
                  uStack_60 = local_68;
                  uStack_5c = local_68;
                  *(float *)(ray + k * 4 + 0x80) = fVar106;
                  local_3a8._0_16_ = *local_390;
                  local_318.valid = (int *)local_3a8;
                  local_318.geometryUserPtr = pGVar15->userPtr;
                  local_318.context = context->user;
                  local_318.ray = (RTCRayN *)ray;
                  local_318.hit = (RTCHitN *)&local_e8;
                  local_318.N = 4;
                  p_Var55 = pGVar15->occlusionFilterN;
                  if (p_Var55 != (RTCFilterFunctionN)0x0) {
                    p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_318);
                  }
                  auVar129._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                  auVar129._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar129._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                  auVar129._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                  uVar62 = movmskps((int)p_Var55,auVar129);
                  pRVar56 = (RTCRayN *)(ulong)(uVar62 ^ 0xf);
                  if ((uVar62 ^ 0xf) == 0) {
                    auVar129 = auVar129 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var55 = context->args->filter;
                    if ((p_Var55 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar15->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var55)(&local_318);
                    }
                    auVar101._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar101._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar101._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar101._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    auVar129 = auVar101 ^ _DAT_01f7ae20;
                    *(undefined1 (*) [16])(local_318.ray + 0x80) =
                         ~auVar101 & _DAT_01f7aa00 |
                         *(undefined1 (*) [16])(local_318.ray + 0x80) & auVar101;
                    pRVar56 = local_318.ray;
                  }
                  auVar130._0_4_ = auVar129._0_4_ << 0x1f;
                  auVar130._4_4_ = auVar129._4_4_ << 0x1f;
                  auVar130._8_4_ = auVar129._8_4_ << 0x1f;
                  auVar130._12_4_ = auVar129._12_4_ << 0x1f;
                  iVar50 = movmskps((int)pRVar56,auVar130);
                  bVar60 = iVar50 != 0;
                  if (!bVar60) {
                    *(float *)(ray + k * 4 + 0x80) = fVar132;
                  }
                }
                bVar57 = (bool)(bVar57 | bVar60);
              }
            }
            break;
          }
          lVar54 = lVar54 + -1;
        } while (lVar54 != 0);
      }
    }
  }
  goto LAB_00b169b6;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }